

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [12];
  undefined8 uVar5;
  ulong uVar6;
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [12];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar64;
  uint uVar65;
  ulong uVar66;
  ulong uVar67;
  uint uVar68;
  long lVar69;
  byte bVar71;
  uint uVar72;
  long lVar73;
  undefined4 uVar74;
  float fVar75;
  vint4 bi;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar76;
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar92 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar116;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  vint4 bi_2;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar130 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 bi_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar185;
  float fVar186;
  float fVar202;
  float fVar204;
  vint4 ai_1;
  undefined1 auVar187 [16];
  float fVar206;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar203;
  float fVar205;
  float fVar207;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar208;
  undefined1 auVar201 [32];
  float fVar209;
  float fVar210;
  float fVar234;
  float fVar236;
  vint4 ai_2;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar239;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar235;
  float fVar237;
  float fVar240;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar238;
  float fVar241;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  vint4 ai;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar255;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar267 [16];
  float fVar268;
  float fVar279;
  float fVar280;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar281;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  float fVar282;
  float fVar283;
  float fVar299;
  float fVar301;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar300;
  float fVar302;
  float fVar303;
  undefined1 auVar298 [32];
  float fVar304;
  float fVar312;
  float fVar313;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar310 [32];
  float fVar314;
  undefined1 auVar311 [32];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [32];
  undefined1 auVar337 [64];
  float fVar338;
  float fVar345;
  float fVar346;
  vfloat4 a0;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  float fVar347;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  float fVar356;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  float fVar367;
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  RTCFilterFunctionNArguments local_500;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  uint auStack_490 [4];
  undefined1 local_480 [16];
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  float afStack_340 [8];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar70;
  undefined1 auVar266 [32];
  undefined1 auVar363 [32];
  
  PVar7 = prim[1];
  uVar66 = (ulong)(byte)PVar7;
  auVar181 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar288 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  lVar69 = uVar66 * 0x25;
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xf + 6)));
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar267 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x11 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1a + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1b + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1c + 6)));
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar216 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar216 = vinsertps_avx(auVar216,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar268 = *(float *)(prim + lVar69 + 0x12);
  auVar96 = vsubps_avx(auVar96,*(undefined1 (*) [16])(prim + lVar69 + 6));
  auVar269._0_4_ = fVar268 * auVar96._0_4_;
  auVar269._4_4_ = fVar268 * auVar96._4_4_;
  auVar269._8_4_ = fVar268 * auVar96._8_4_;
  auVar269._12_4_ = fVar268 * auVar96._12_4_;
  auVar357._0_4_ = fVar268 * auVar216._0_4_;
  auVar357._4_4_ = fVar268 * auVar216._4_4_;
  auVar357._8_4_ = fVar268 * auVar216._8_4_;
  auVar357._12_4_ = fVar268 * auVar216._12_4_;
  auVar15 = vcvtdq2ps_avx(auVar181);
  auVar144 = vcvtdq2ps_avx(auVar288);
  auVar132 = vcvtdq2ps_avx(auVar16);
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar267 = vcvtdq2ps_avx(auVar267);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar96 = vshufps_avx(auVar357,auVar357,0);
  auVar216 = vshufps_avx(auVar357,auVar357,0x55);
  auVar181 = vshufps_avx(auVar357,auVar357,0xaa);
  fVar268 = auVar181._0_4_;
  fVar280 = auVar181._4_4_;
  fVar185 = auVar181._8_4_;
  fVar204 = auVar181._12_4_;
  fVar279 = auVar216._0_4_;
  fVar281 = auVar216._4_4_;
  fVar202 = auVar216._8_4_;
  fVar206 = auVar216._12_4_;
  fVar209 = auVar96._0_4_;
  fVar234 = auVar96._4_4_;
  fVar236 = auVar96._8_4_;
  fVar239 = auVar96._12_4_;
  auVar211._0_4_ = fVar209 * auVar15._0_4_ + auVar144._0_4_ * fVar279 + auVar132._0_4_ * fVar268;
  auVar211._4_4_ = fVar234 * auVar15._4_4_ + auVar144._4_4_ * fVar281 + auVar132._4_4_ * fVar280;
  auVar211._8_4_ = fVar236 * auVar15._8_4_ + auVar144._8_4_ * fVar202 + auVar132._8_4_ * fVar185;
  auVar211._12_4_ = fVar239 * auVar15._12_4_ + auVar144._12_4_ * fVar206 + auVar132._12_4_ * fVar204
  ;
  auVar187._0_4_ = fVar209 * auVar167._0_4_ + auVar133._0_4_ * fVar279 + auVar267._0_4_ * fVar268;
  auVar187._4_4_ = fVar234 * auVar167._4_4_ + auVar133._4_4_ * fVar281 + auVar267._4_4_ * fVar280;
  auVar187._8_4_ = fVar236 * auVar167._8_4_ + auVar133._8_4_ * fVar202 + auVar267._8_4_ * fVar185;
  auVar187._12_4_ =
       fVar239 * auVar167._12_4_ + auVar133._12_4_ * fVar206 + auVar267._12_4_ * fVar204;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar121 = vpmovsxwd_avx(auVar96);
  auVar96 = vcvtdq2ps_avx(auVar79);
  auVar327._0_4_ = fVar209 * auVar96._0_4_ + auVar17._0_4_ * fVar279 + auVar78._0_4_ * fVar268;
  auVar327._4_4_ = fVar234 * auVar96._4_4_ + auVar17._4_4_ * fVar281 + auVar78._4_4_ * fVar280;
  auVar327._8_4_ = fVar236 * auVar96._8_4_ + auVar17._8_4_ * fVar202 + auVar78._8_4_ * fVar185;
  auVar327._12_4_ = fVar239 * auVar96._12_4_ + auVar17._12_4_ * fVar206 + auVar78._12_4_ * fVar204;
  auVar216 = vshufps_avx(auVar269,auVar269,0xaa);
  fVar268 = auVar216._0_4_;
  fVar280 = auVar216._4_4_;
  fVar185 = auVar216._8_4_;
  fVar204 = auVar216._12_4_;
  auVar216 = vshufps_avx(auVar269,auVar269,0x55);
  fVar279 = auVar216._0_4_;
  fVar281 = auVar216._4_4_;
  fVar202 = auVar216._8_4_;
  fVar206 = auVar216._12_4_;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar79 = vpmovsxwd_avx(auVar216);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar152 = vpmovsxwd_avx(auVar181);
  auVar288._8_8_ = 0;
  auVar288._0_8_ = *(ulong *)(prim + uVar66 * 0xd + 6);
  auVar288 = vpmovsxwd_avx(auVar288);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar66 * 0x12 + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar216 = vshufps_avx(auVar269,auVar269,0);
  fVar209 = auVar216._0_4_;
  fVar234 = auVar216._4_4_;
  fVar236 = auVar216._8_4_;
  fVar239 = auVar216._12_4_;
  auVar77._0_4_ = fVar209 * auVar15._0_4_ + auVar144._0_4_ * fVar279 + auVar132._0_4_ * fVar268;
  auVar77._4_4_ = fVar234 * auVar15._4_4_ + auVar144._4_4_ * fVar281 + auVar132._4_4_ * fVar280;
  auVar77._8_4_ = fVar236 * auVar15._8_4_ + auVar144._8_4_ * fVar202 + auVar132._8_4_ * fVar185;
  auVar77._12_4_ = fVar239 * auVar15._12_4_ + auVar144._12_4_ * fVar206 + auVar132._12_4_ * fVar204;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar66 * 0x16 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar151._0_4_ = auVar133._0_4_ * fVar279 + auVar267._0_4_ * fVar268 + fVar209 * auVar167._0_4_;
  auVar151._4_4_ = auVar133._4_4_ * fVar281 + auVar267._4_4_ * fVar280 + fVar234 * auVar167._4_4_;
  auVar151._8_4_ = auVar133._8_4_ * fVar202 + auVar267._8_4_ * fVar185 + fVar236 * auVar167._8_4_;
  auVar151._12_4_ =
       auVar133._12_4_ * fVar206 + auVar267._12_4_ * fVar204 + fVar239 * auVar167._12_4_;
  auVar120._0_4_ = auVar96._0_4_ * fVar209 + auVar17._0_4_ * fVar279 + auVar78._0_4_ * fVar268;
  auVar120._4_4_ = auVar96._4_4_ * fVar234 + auVar17._4_4_ * fVar281 + auVar78._4_4_ * fVar280;
  auVar120._8_4_ = auVar96._8_4_ * fVar236 + auVar17._8_4_ * fVar202 + auVar78._8_4_ * fVar185;
  auVar120._12_4_ = auVar96._12_4_ * fVar239 + auVar17._12_4_ * fVar206 + auVar78._12_4_ * fVar204;
  auVar358._8_4_ = 0x7fffffff;
  auVar358._0_8_ = 0x7fffffff7fffffff;
  auVar358._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar358,auVar211);
  auVar318._8_4_ = 0x219392ef;
  auVar318._0_8_ = 0x219392ef219392ef;
  auVar318._12_4_ = 0x219392ef;
  auVar96 = vcmpps_avx(auVar96,auVar318,1);
  auVar216 = vblendvps_avx(auVar211,auVar318,auVar96);
  auVar96 = vandps_avx(auVar358,auVar187);
  auVar96 = vcmpps_avx(auVar96,auVar318,1);
  auVar181 = vblendvps_avx(auVar187,auVar318,auVar96);
  auVar96 = vandps_avx(auVar327,auVar358);
  auVar96 = vcmpps_avx(auVar96,auVar318,1);
  auVar96 = vblendvps_avx(auVar327,auVar318,auVar96);
  auVar144 = vrcpps_avx(auVar216);
  fVar185 = auVar144._0_4_;
  auVar212._0_4_ = fVar185 * auVar216._0_4_;
  fVar202 = auVar144._4_4_;
  auVar212._4_4_ = fVar202 * auVar216._4_4_;
  fVar204 = auVar144._8_4_;
  auVar212._8_4_ = fVar204 * auVar216._8_4_;
  fVar206 = auVar144._12_4_;
  auVar212._12_4_ = fVar206 * auVar216._12_4_;
  auVar328._8_4_ = 0x3f800000;
  auVar328._0_8_ = 0x3f8000003f800000;
  auVar328._12_4_ = 0x3f800000;
  auVar216 = vsubps_avx(auVar328,auVar212);
  fVar185 = fVar185 + fVar185 * auVar216._0_4_;
  fVar202 = fVar202 + fVar202 * auVar216._4_4_;
  fVar204 = fVar204 + fVar204 * auVar216._8_4_;
  fVar206 = fVar206 + fVar206 * auVar216._12_4_;
  auVar216 = vrcpps_avx(auVar181);
  fVar209 = auVar216._0_4_;
  auVar270._0_4_ = fVar209 * auVar181._0_4_;
  fVar234 = auVar216._4_4_;
  auVar270._4_4_ = fVar234 * auVar181._4_4_;
  fVar236 = auVar216._8_4_;
  auVar270._8_4_ = fVar236 * auVar181._8_4_;
  fVar239 = auVar216._12_4_;
  auVar270._12_4_ = fVar239 * auVar181._12_4_;
  auVar216 = vsubps_avx(auVar328,auVar270);
  fVar209 = fVar209 + fVar209 * auVar216._0_4_;
  fVar234 = fVar234 + fVar234 * auVar216._4_4_;
  fVar236 = fVar236 + fVar236 * auVar216._8_4_;
  fVar239 = fVar239 + fVar239 * auVar216._12_4_;
  auVar216 = vrcpps_avx(auVar96);
  fVar268 = auVar216._0_4_;
  auVar319._0_4_ = auVar96._0_4_ * fVar268;
  fVar279 = auVar216._4_4_;
  auVar319._4_4_ = auVar96._4_4_ * fVar279;
  fVar280 = auVar216._8_4_;
  auVar319._8_4_ = auVar96._8_4_ * fVar280;
  fVar281 = auVar216._12_4_;
  auVar319._12_4_ = auVar96._12_4_ * fVar281;
  auVar96 = vsubps_avx(auVar328,auVar319);
  fVar268 = auVar96._0_4_ * fVar268 + fVar268;
  fVar279 = auVar96._4_4_ * fVar279 + fVar279;
  fVar280 = auVar96._8_4_ * fVar280 + fVar280;
  fVar281 = auVar96._12_4_ * fVar281 + fVar281;
  auVar96 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar69 + 0x16)) *
                          *(float *)(prim + lVar69 + 0x1a)));
  auVar181 = vshufps_avx(auVar96,auVar96,0);
  auVar96 = vcvtdq2ps_avx(auVar121);
  auVar216 = vcvtdq2ps_avx(auVar79);
  auVar216 = vsubps_avx(auVar216,auVar96);
  fVar75 = auVar181._0_4_;
  fVar76 = auVar181._4_4_;
  fVar186 = auVar181._8_4_;
  fVar203 = auVar181._12_4_;
  auVar242._0_4_ = fVar75 * auVar216._0_4_ + auVar96._0_4_;
  auVar242._4_4_ = fVar76 * auVar216._4_4_ + auVar96._4_4_;
  auVar242._8_4_ = fVar186 * auVar216._8_4_ + auVar96._8_4_;
  auVar242._12_4_ = fVar203 * auVar216._12_4_ + auVar96._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar152);
  auVar216 = vcvtdq2ps_avx(auVar288);
  auVar216 = vsubps_avx(auVar216,auVar96);
  auVar256._0_4_ = fVar75 * auVar216._0_4_ + auVar96._0_4_;
  auVar256._4_4_ = fVar76 * auVar216._4_4_ + auVar96._4_4_;
  auVar256._8_4_ = fVar186 * auVar216._8_4_ + auVar96._8_4_;
  auVar256._12_4_ = fVar203 * auVar216._12_4_ + auVar96._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar16);
  auVar216 = vcvtdq2ps_avx(auVar15);
  auVar181 = vsubps_avx(auVar216,auVar96);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + uVar66 * 0x14 + 6);
  auVar216 = vpmovsxwd_avx(auVar144);
  auVar284._0_4_ = fVar75 * auVar181._0_4_ + auVar96._0_4_;
  auVar284._4_4_ = fVar76 * auVar181._4_4_ + auVar96._4_4_;
  auVar284._8_4_ = fVar186 * auVar181._8_4_ + auVar96._8_4_;
  auVar284._12_4_ = fVar203 * auVar181._12_4_ + auVar96._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar216);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar66 * 0x18 + 6);
  auVar216 = vpmovsxwd_avx(auVar132);
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar216 = vsubps_avx(auVar216,auVar96);
  auVar305._0_4_ = fVar75 * auVar216._0_4_ + auVar96._0_4_;
  auVar305._4_4_ = fVar76 * auVar216._4_4_ + auVar96._4_4_;
  auVar305._8_4_ = fVar186 * auVar216._8_4_ + auVar96._8_4_;
  auVar305._12_4_ = fVar203 * auVar216._12_4_ + auVar96._12_4_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar66 * 0x1d + 6);
  auVar96 = vpmovsxwd_avx(auVar167);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar66 * 0x21 + 6);
  auVar216 = vpmovsxwd_avx(auVar133);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar216 = vsubps_avx(auVar216,auVar96);
  auVar320._0_4_ = fVar75 * auVar216._0_4_ + auVar96._0_4_;
  auVar320._4_4_ = fVar76 * auVar216._4_4_ + auVar96._4_4_;
  auVar320._8_4_ = fVar186 * auVar216._8_4_ + auVar96._8_4_;
  auVar320._12_4_ = fVar203 * auVar216._12_4_ + auVar96._12_4_;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = *(ulong *)(prim + uVar66 * 0x1f + 6);
  auVar96 = vpmovsxwd_avx(auVar267);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar66 * 0x23 + 6);
  auVar216 = vpmovsxwd_avx(auVar17);
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar216 = vsubps_avx(auVar216,auVar96);
  auVar329._0_4_ = fVar75 * auVar216._0_4_ + auVar96._0_4_;
  auVar329._4_4_ = fVar76 * auVar216._4_4_ + auVar96._4_4_;
  auVar329._8_4_ = fVar186 * auVar216._8_4_ + auVar96._8_4_;
  auVar329._12_4_ = fVar203 * auVar216._12_4_ + auVar96._12_4_;
  auVar96 = vsubps_avx(auVar242,auVar77);
  auVar243._0_4_ = fVar185 * auVar96._0_4_;
  auVar243._4_4_ = fVar202 * auVar96._4_4_;
  auVar243._8_4_ = fVar204 * auVar96._8_4_;
  auVar243._12_4_ = fVar206 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar256,auVar77);
  auVar78._0_4_ = fVar185 * auVar96._0_4_;
  auVar78._4_4_ = fVar202 * auVar96._4_4_;
  auVar78._8_4_ = fVar204 * auVar96._8_4_;
  auVar78._12_4_ = fVar206 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar284,auVar151);
  auVar188._0_4_ = fVar209 * auVar96._0_4_;
  auVar188._4_4_ = fVar234 * auVar96._4_4_;
  auVar188._8_4_ = fVar236 * auVar96._8_4_;
  auVar188._12_4_ = fVar239 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar305,auVar151);
  auVar152._0_4_ = fVar209 * auVar96._0_4_;
  auVar152._4_4_ = fVar234 * auVar96._4_4_;
  auVar152._8_4_ = fVar236 * auVar96._8_4_;
  auVar152._12_4_ = fVar239 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar320,auVar120);
  auVar213._0_4_ = fVar268 * auVar96._0_4_;
  auVar213._4_4_ = fVar279 * auVar96._4_4_;
  auVar213._8_4_ = fVar280 * auVar96._8_4_;
  auVar213._12_4_ = fVar281 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar329,auVar120);
  auVar121._0_4_ = fVar268 * auVar96._0_4_;
  auVar121._4_4_ = fVar279 * auVar96._4_4_;
  auVar121._8_4_ = fVar280 * auVar96._8_4_;
  auVar121._12_4_ = fVar281 * auVar96._12_4_;
  auVar96 = vpminsd_avx(auVar243,auVar78);
  auVar216 = vpminsd_avx(auVar188,auVar152);
  auVar96 = vmaxps_avx(auVar96,auVar216);
  auVar216 = vpminsd_avx(auVar213,auVar121);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar285._4_4_ = uVar74;
  auVar285._0_4_ = uVar74;
  auVar285._8_4_ = uVar74;
  auVar285._12_4_ = uVar74;
  auVar216 = vmaxps_avx(auVar216,auVar285);
  auVar96 = vmaxps_avx(auVar96,auVar216);
  local_480._0_4_ = auVar96._0_4_ * 0.99999964;
  local_480._4_4_ = auVar96._4_4_ * 0.99999964;
  local_480._8_4_ = auVar96._8_4_ * 0.99999964;
  local_480._12_4_ = auVar96._12_4_ * 0.99999964;
  auVar96 = vpmaxsd_avx(auVar243,auVar78);
  auVar216 = vpmaxsd_avx(auVar188,auVar152);
  auVar96 = vminps_avx(auVar96,auVar216);
  auVar216 = vpmaxsd_avx(auVar213,auVar121);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar153._4_4_ = uVar74;
  auVar153._0_4_ = uVar74;
  auVar153._8_4_ = uVar74;
  auVar153._12_4_ = uVar74;
  auVar216 = vminps_avx(auVar216,auVar153);
  auVar96 = vminps_avx(auVar96,auVar216);
  auVar79._0_4_ = auVar96._0_4_ * 1.0000004;
  auVar79._4_4_ = auVar96._4_4_ * 1.0000004;
  auVar79._8_4_ = auVar96._8_4_ * 1.0000004;
  auVar79._12_4_ = auVar96._12_4_ * 1.0000004;
  auVar96 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar216 = vpcmpgtd_avx(auVar96,_DAT_01f4ad30);
  auVar96 = vcmpps_avx(local_480,auVar79,2);
  auVar96 = vandps_avx(auVar96,auVar216);
  uVar74 = vmovmskps_avx(auVar96);
  uVar66 = CONCAT44((int)((ulong)prim >> 0x20),uVar74);
  auVar108._16_16_ = mm_lookupmask_ps._240_16_;
  auVar108._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar108,ZEXT832(0) << 0x20,0x80);
  uVar72 = 1 << ((byte)k & 0x1f);
  auVar55 = ZEXT412(0);
LAB_008eca21:
  auVar57._12_4_ = 0;
  auVar57._0_12_ = auVar55;
  if (uVar66 == 0) {
    return;
  }
  lVar69 = 0;
  if (uVar66 != 0) {
    for (; (uVar66 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
    }
  }
  uVar65 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar65].ptr;
  fVar268 = (pGVar9->time_range).lower;
  fVar268 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar268) / ((pGVar9->time_range).upper - fVar268));
  auVar96 = vroundss_avx(ZEXT416((uint)fVar268),ZEXT416((uint)fVar268),9);
  auVar96 = vminss_avx(auVar96,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar96 = vmaxss_avx(auVar57 << 0x20,auVar96);
  uVar8 = *(uint *)(prim + lVar69 * 4 + 6);
  uVar67 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar8 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar73 = (long)(int)auVar96._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar73);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar73);
  pfVar3 = (float *)(lVar11 + lVar12 * uVar67);
  fVar279 = *pfVar3;
  fVar280 = pfVar3[1];
  fVar281 = pfVar3[2];
  fVar185 = pfVar3[3];
  lVar69 = uVar67 + 1;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar69);
  fVar202 = *pfVar3;
  fVar204 = pfVar3[1];
  fVar206 = pfVar3[2];
  fVar209 = pfVar3[3];
  lVar1 = uVar67 + 2;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
  fVar234 = *pfVar3;
  fVar236 = pfVar3[1];
  fVar239 = pfVar3[2];
  fVar75 = pfVar3[3];
  lVar2 = uVar67 + 3;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
  fVar76 = *pfVar3;
  fVar186 = pfVar3[1];
  fVar203 = pfVar3[2];
  fVar205 = pfVar3[3];
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar73);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar73);
  pfVar3 = (float *)(lVar12 + lVar13 * uVar67);
  fVar207 = *pfVar3;
  fVar210 = pfVar3[1];
  fVar235 = pfVar3[2];
  fVar237 = pfVar3[3];
  pfVar3 = (float *)(lVar12 + lVar13 * lVar69);
  fVar240 = *pfVar3;
  fVar238 = pfVar3[1];
  fVar241 = pfVar3[2];
  fVar116 = pfVar3[3];
  pfVar3 = (float *)(lVar12 + lVar13 * lVar1);
  fVar117 = *pfVar3;
  fVar118 = pfVar3[1];
  fVar119 = pfVar3[2];
  fVar208 = pfVar3[3];
  fVar268 = fVar268 - auVar96._0_4_;
  pfVar3 = (float *)(lVar12 + lVar13 * lVar2);
  fVar255 = *pfVar3;
  fVar282 = pfVar3[1];
  fVar283 = pfVar3[2];
  fVar299 = pfVar3[3];
  local_700._0_4_ = fVar279 * 0.16666667 + fVar202 * 0.6666667 + fVar234 * 0.16666667 + fVar76 * 0.0
  ;
  local_700._4_4_ =
       fVar280 * 0.16666667 + fVar204 * 0.6666667 + fVar236 * 0.16666667 + fVar186 * 0.0;
  fStack_6f8 = fVar281 * 0.16666667 + fVar206 * 0.6666667 + fVar239 * 0.16666667 + fVar203 * 0.0;
  fStack_6f4 = fVar185 * 0.16666667 + fVar209 * 0.6666667 + fVar75 * 0.16666667 + fVar205 * 0.0;
  auVar80._0_4_ = fVar234 * 0.5 + fVar76 * 0.0;
  auVar80._4_4_ = fVar236 * 0.5 + fVar186 * 0.0;
  auVar80._8_4_ = fVar239 * 0.5 + fVar203 * 0.0;
  auVar80._12_4_ = fVar75 * 0.5 + fVar205 * 0.0;
  auVar154._0_4_ = fVar202 * 0.0;
  auVar154._4_4_ = fVar204 * 0.0;
  auVar154._8_4_ = fVar206 * 0.0;
  auVar154._12_4_ = fVar209 * 0.0;
  auVar96 = vsubps_avx(auVar80,auVar154);
  auVar155._0_4_ = fVar279 * 0.5;
  auVar155._4_4_ = fVar280 * 0.5;
  auVar155._8_4_ = fVar281 * 0.5;
  auVar155._12_4_ = fVar185 * 0.5;
  auVar132 = vsubps_avx(auVar96,auVar155);
  auVar81._0_4_ = fVar207 * 0.16666667 + fVar240 * 0.6666667 + fVar117 * 0.16666667 + fVar255 * 0.0;
  auVar81._4_4_ = fVar210 * 0.16666667 + fVar238 * 0.6666667 + fVar118 * 0.16666667 + fVar282 * 0.0;
  auVar81._8_4_ = fVar235 * 0.16666667 + fVar241 * 0.6666667 + fVar119 * 0.16666667 + fVar283 * 0.0;
  auVar81._12_4_ = fVar237 * 0.16666667 + fVar116 * 0.6666667 + fVar208 * 0.16666667 + fVar299 * 0.0
  ;
  auVar257._0_4_ = fVar117 * 0.5 + fVar255 * 0.0;
  auVar257._4_4_ = fVar118 * 0.5 + fVar282 * 0.0;
  auVar257._8_4_ = fVar119 * 0.5 + fVar283 * 0.0;
  auVar257._12_4_ = fVar208 * 0.5 + fVar299 * 0.0;
  auVar339._0_4_ = fVar240 * 0.0;
  auVar339._4_4_ = fVar238 * 0.0;
  auVar339._8_4_ = fVar241 * 0.0;
  auVar339._12_4_ = fVar116 * 0.0;
  auVar96 = vsubps_avx(auVar257,auVar339);
  auVar340._0_4_ = fVar207 * 0.5;
  auVar340._4_4_ = fVar210 * 0.5;
  auVar340._8_4_ = fVar235 * 0.5;
  auVar340._12_4_ = fVar237 * 0.5;
  auVar288 = vsubps_avx(auVar96,auVar340);
  auVar214._0_4_ = fVar279 * 0.0;
  auVar214._4_4_ = fVar280 * 0.0;
  auVar214._8_4_ = fVar281 * 0.0;
  auVar214._12_4_ = fVar185 * 0.0;
  auVar258._0_4_ = auVar214._0_4_ + fVar202 * 0.16666667 + fVar234 * 0.6666667 + fVar76 * 0.16666667
  ;
  auVar258._4_4_ =
       auVar214._4_4_ + fVar204 * 0.16666667 + fVar236 * 0.6666667 + fVar186 * 0.16666667;
  auVar258._8_4_ =
       auVar214._8_4_ + fVar206 * 0.16666667 + fVar239 * 0.6666667 + fVar203 * 0.16666667;
  auVar258._12_4_ =
       auVar214._12_4_ + fVar209 * 0.16666667 + fVar75 * 0.6666667 + fVar205 * 0.16666667;
  auVar271._0_4_ = fVar76 * 0.5 + fVar234 * 0.0;
  auVar271._4_4_ = fVar186 * 0.5 + fVar236 * 0.0;
  auVar271._8_4_ = fVar203 * 0.5 + fVar239 * 0.0;
  auVar271._12_4_ = fVar205 * 0.5 + fVar75 * 0.0;
  auVar189._0_4_ = fVar202 * 0.5;
  auVar189._4_4_ = fVar204 * 0.5;
  auVar189._8_4_ = fVar206 * 0.5;
  auVar189._12_4_ = fVar209 * 0.5;
  auVar96 = vsubps_avx(auVar271,auVar189);
  auVar167 = vsubps_avx(auVar96,auVar214);
  auVar215._0_4_ = fVar207 * 0.0;
  auVar215._4_4_ = fVar210 * 0.0;
  auVar215._8_4_ = fVar235 * 0.0;
  auVar215._12_4_ = fVar237 * 0.0;
  auVar190._0_4_ =
       auVar215._0_4_ + fVar240 * 0.16666667 + fVar117 * 0.6666667 + fVar255 * 0.16666667;
  auVar190._4_4_ =
       auVar215._4_4_ + fVar238 * 0.16666667 + fVar118 * 0.6666667 + fVar282 * 0.16666667;
  auVar190._8_4_ =
       auVar215._8_4_ + fVar241 * 0.16666667 + fVar119 * 0.6666667 + fVar283 * 0.16666667;
  auVar190._12_4_ =
       auVar215._12_4_ + fVar116 * 0.16666667 + fVar208 * 0.6666667 + fVar299 * 0.16666667;
  auVar272._0_4_ = fVar117 * 0.0 + fVar255 * 0.5;
  auVar272._4_4_ = fVar118 * 0.0 + fVar282 * 0.5;
  auVar272._8_4_ = fVar119 * 0.0 + fVar283 * 0.5;
  auVar272._12_4_ = fVar208 * 0.0 + fVar299 * 0.5;
  auVar244._0_4_ = fVar240 * 0.5;
  auVar244._4_4_ = fVar238 * 0.5;
  auVar244._8_4_ = fVar241 * 0.5;
  auVar244._12_4_ = fVar116 * 0.5;
  auVar96 = vsubps_avx(auVar272,auVar244);
  auVar15 = vsubps_avx(auVar96,auVar215);
  auVar96 = vshufps_avx(auVar132,auVar132,0xc9);
  auVar216 = vshufps_avx(auVar81,auVar81,0xc9);
  fVar118 = auVar132._0_4_;
  auVar245._0_4_ = fVar118 * auVar216._0_4_;
  fVar119 = auVar132._4_4_;
  auVar245._4_4_ = fVar119 * auVar216._4_4_;
  fVar208 = auVar132._8_4_;
  auVar245._8_4_ = fVar208 * auVar216._8_4_;
  fVar255 = auVar132._12_4_;
  auVar245._12_4_ = fVar255 * auVar216._12_4_;
  auVar82._0_4_ = auVar96._0_4_ * auVar81._0_4_;
  auVar82._4_4_ = auVar96._4_4_ * auVar81._4_4_;
  auVar82._8_4_ = auVar96._8_4_ * auVar81._8_4_;
  auVar82._12_4_ = auVar96._12_4_ * auVar81._12_4_;
  auVar216 = vsubps_avx(auVar82,auVar245);
  auVar181 = vshufps_avx(auVar216,auVar216,0xc9);
  auVar216 = vshufps_avx(auVar288,auVar288,0xc9);
  auVar83._0_4_ = fVar118 * auVar216._0_4_;
  auVar83._4_4_ = fVar119 * auVar216._4_4_;
  auVar83._8_4_ = fVar208 * auVar216._8_4_;
  auVar83._12_4_ = fVar255 * auVar216._12_4_;
  auVar273._0_4_ = auVar288._0_4_ * auVar96._0_4_;
  auVar273._4_4_ = auVar288._4_4_ * auVar96._4_4_;
  auVar273._8_4_ = auVar288._8_4_ * auVar96._8_4_;
  auVar273._12_4_ = auVar288._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar273,auVar83);
  auVar288 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar96 = vshufps_avx(auVar167,auVar167,0xc9);
  auVar216 = vshufps_avx(auVar190,auVar190,0xc9);
  fVar282 = auVar167._0_4_;
  auVar286._0_4_ = fVar282 * auVar216._0_4_;
  fVar283 = auVar167._4_4_;
  auVar286._4_4_ = fVar283 * auVar216._4_4_;
  fVar299 = auVar167._8_4_;
  auVar286._8_4_ = fVar299 * auVar216._8_4_;
  fVar300 = auVar167._12_4_;
  auVar286._12_4_ = fVar300 * auVar216._12_4_;
  auVar191._0_4_ = auVar96._0_4_ * auVar190._0_4_;
  auVar191._4_4_ = auVar96._4_4_ * auVar190._4_4_;
  auVar191._8_4_ = auVar96._8_4_ * auVar190._8_4_;
  auVar191._12_4_ = auVar96._12_4_ * auVar190._12_4_;
  auVar216 = vsubps_avx(auVar191,auVar286);
  auVar16 = vshufps_avx(auVar216,auVar216,0xc9);
  auVar216 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar287._0_4_ = fVar282 * auVar216._0_4_;
  auVar287._4_4_ = fVar283 * auVar216._4_4_;
  auVar287._8_4_ = fVar299 * auVar216._8_4_;
  auVar287._12_4_ = fVar300 * auVar216._12_4_;
  auVar84._0_4_ = auVar96._0_4_ * auVar15._0_4_;
  auVar84._4_4_ = auVar96._4_4_ * auVar15._4_4_;
  auVar84._8_4_ = auVar96._8_4_ * auVar15._8_4_;
  auVar84._12_4_ = auVar96._12_4_ * auVar15._12_4_;
  auVar96 = vdpps_avx(auVar181,auVar181,0x7f);
  auVar216 = vsubps_avx(auVar84,auVar287);
  auVar15 = vshufps_avx(auVar216,auVar216,0xc9);
  fVar280 = auVar96._0_4_;
  auVar267 = ZEXT416((uint)fVar280);
  auVar216 = vrsqrtss_avx(auVar267,auVar267);
  fVar279 = auVar216._0_4_;
  auVar216 = ZEXT416((uint)(fVar279 * 1.5 - fVar280 * 0.5 * fVar279 * fVar279 * fVar279));
  auVar144 = vshufps_avx(auVar216,auVar216,0);
  fVar210 = auVar144._0_4_ * auVar181._0_4_;
  fVar235 = auVar144._4_4_ * auVar181._4_4_;
  fVar237 = auVar144._8_4_ * auVar181._8_4_;
  fVar240 = auVar144._12_4_ * auVar181._12_4_;
  auVar216 = vdpps_avx(auVar181,auVar288,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar274._0_4_ = auVar96._0_4_ * auVar288._0_4_;
  auVar274._4_4_ = auVar96._4_4_ * auVar288._4_4_;
  auVar274._8_4_ = auVar96._8_4_ * auVar288._8_4_;
  auVar274._12_4_ = auVar96._12_4_ * auVar288._12_4_;
  auVar96 = vshufps_avx(auVar216,auVar216,0);
  auVar246._0_4_ = auVar96._0_4_ * auVar181._0_4_;
  auVar246._4_4_ = auVar96._4_4_ * auVar181._4_4_;
  auVar246._8_4_ = auVar96._8_4_ * auVar181._8_4_;
  auVar246._12_4_ = auVar96._12_4_ * auVar181._12_4_;
  auVar133 = vsubps_avx(auVar274,auVar246);
  auVar96 = vrcpss_avx(auVar267,auVar267);
  auVar96 = ZEXT416((uint)((2.0 - fVar280 * auVar96._0_4_) * auVar96._0_4_));
  auVar181 = vshufps_avx(auVar96,auVar96,0);
  auVar96 = vdpps_avx(auVar16,auVar16,0x7f);
  fVar238 = auVar96._0_4_;
  auVar288 = ZEXT416((uint)fVar238);
  auVar216 = vrsqrtss_avx(auVar288,auVar288);
  fVar186 = auVar216._0_4_;
  auVar216 = vdpps_avx(auVar16,auVar15,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar364._0_4_ = auVar96._0_4_ * auVar15._0_4_;
  auVar364._4_4_ = auVar96._4_4_ * auVar15._4_4_;
  auVar364._8_4_ = auVar96._8_4_ * auVar15._8_4_;
  auVar364._12_4_ = auVar96._12_4_ * auVar15._12_4_;
  lVar12 = *(long *)(_Var10 + 0x38 + lVar73);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar73);
  pauVar4 = (undefined1 (*) [12])(lVar12 + lVar13 * uVar67);
  auVar55 = *pauVar4;
  fVar279 = *(float *)pauVar4[1];
  pfVar3 = (float *)(lVar12 + lVar13 * lVar69);
  fVar280 = *pfVar3;
  fVar281 = pfVar3[1];
  fVar185 = pfVar3[2];
  fVar202 = pfVar3[3];
  pfVar3 = (float *)(lVar12 + lVar13 * lVar1);
  fVar204 = *pfVar3;
  fVar206 = pfVar3[1];
  fVar209 = pfVar3[2];
  fVar234 = pfVar3[3];
  auVar96 = vshufps_avx(auVar216,auVar216,0);
  auVar85._0_4_ = auVar96._0_4_ * auVar16._0_4_;
  auVar85._4_4_ = auVar96._4_4_ * auVar16._4_4_;
  auVar85._8_4_ = auVar96._8_4_ * auVar16._8_4_;
  auVar85._12_4_ = auVar96._12_4_ * auVar16._12_4_;
  auVar15 = vsubps_avx(auVar364,auVar85);
  pfVar3 = (float *)(lVar12 + lVar13 * lVar2);
  fVar236 = *pfVar3;
  fVar239 = pfVar3[1];
  fVar75 = pfVar3[2];
  fVar76 = pfVar3[3];
  lVar12 = *(long *)(lVar11 + 0x38 + lVar73);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar73);
  auVar96 = ZEXT416((uint)(fVar186 * 1.5 - fVar238 * 0.5 * fVar186 * fVar186 * fVar186));
  auVar216 = vshufps_avx(auVar96,auVar96,0);
  fVar186 = auVar216._0_4_ * auVar16._0_4_;
  fVar203 = auVar216._4_4_ * auVar16._4_4_;
  fVar205 = auVar216._8_4_ * auVar16._8_4_;
  fVar207 = auVar216._12_4_ * auVar16._12_4_;
  auVar96 = vrcpss_avx(auVar288,auVar288);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - auVar96._0_4_ * fVar238)));
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar288 = vshufps_avx(_local_700,_local_700,0xff);
  auVar321._0_4_ = auVar288._0_4_ * fVar210;
  auVar321._4_4_ = auVar288._4_4_ * fVar235;
  auVar321._8_4_ = auVar288._8_4_ * fVar237;
  auVar321._12_4_ = auVar288._12_4_ * fVar240;
  auVar16 = vshufps_avx(auVar132,auVar132,0xff);
  auVar267 = vsubps_avx(_local_700,auVar321);
  auVar217._0_4_ =
       auVar16._0_4_ * fVar210 + auVar288._0_4_ * auVar144._0_4_ * auVar133._0_4_ * auVar181._0_4_;
  auVar217._4_4_ =
       auVar16._4_4_ * fVar235 + auVar288._4_4_ * auVar144._4_4_ * auVar133._4_4_ * auVar181._4_4_;
  auVar217._8_4_ =
       auVar16._8_4_ * fVar237 + auVar288._8_4_ * auVar144._8_4_ * auVar133._8_4_ * auVar181._8_4_;
  auVar217._12_4_ =
       auVar16._12_4_ * fVar240 +
       auVar288._12_4_ * auVar144._12_4_ * auVar133._12_4_ * auVar181._12_4_;
  auVar144 = vsubps_avx(auVar132,auVar217);
  local_700._0_4_ = (float)local_700._0_4_ + auVar321._0_4_;
  local_700._4_4_ = (float)local_700._4_4_ + auVar321._4_4_;
  fStack_6f8 = fStack_6f8 + auVar321._8_4_;
  fStack_6f4 = fStack_6f4 + auVar321._12_4_;
  auVar181 = vshufps_avx(auVar258,auVar258,0xff);
  auVar156._0_4_ = auVar181._0_4_ * fVar186;
  auVar156._4_4_ = auVar181._4_4_ * fVar203;
  auVar156._8_4_ = auVar181._8_4_ * fVar205;
  auVar156._12_4_ = auVar181._12_4_ * fVar207;
  auVar288 = vshufps_avx(auVar167,auVar167,0xff);
  auVar132 = vsubps_avx(auVar258,auVar156);
  auVar86._0_4_ =
       auVar288._0_4_ * fVar186 + auVar181._0_4_ * auVar216._0_4_ * auVar15._0_4_ * auVar96._0_4_;
  auVar86._4_4_ =
       auVar288._4_4_ * fVar203 + auVar181._4_4_ * auVar216._4_4_ * auVar15._4_4_ * auVar96._4_4_;
  auVar86._8_4_ =
       auVar288._8_4_ * fVar205 + auVar181._8_4_ * auVar216._8_4_ * auVar15._8_4_ * auVar96._8_4_;
  auVar86._12_4_ =
       auVar288._12_4_ * fVar207 +
       auVar181._12_4_ * auVar216._12_4_ * auVar15._12_4_ * auVar96._12_4_;
  auVar167 = vsubps_avx(auVar167,auVar86);
  local_6b0._4_4_ = auVar258._4_4_ + auVar156._4_4_;
  local_6b0._0_4_ = auVar258._0_4_ + auVar156._0_4_;
  fStack_6a8 = auVar258._8_4_ + auVar156._8_4_;
  fStack_6a4 = auVar258._12_4_ + auVar156._12_4_;
  local_6c0._0_4_ =
       *(float *)*pauVar4 * 0.16666667 + fVar280 * 0.6666667 + fVar204 * 0.16666667 + fVar236 * 0.0;
  local_6c0._4_4_ =
       *(float *)(*pauVar4 + 4) * 0.16666667 +
       fVar281 * 0.6666667 + fVar206 * 0.16666667 + fVar239 * 0.0;
  fStack_6b8 = *(float *)(*pauVar4 + 8) * 0.16666667 +
               fVar185 * 0.6666667 + fVar209 * 0.16666667 + fVar75 * 0.0;
  fStack_6b4 = fVar279 * 0.16666667 + fVar202 * 0.6666667 + fVar234 * 0.16666667 + fVar76 * 0.0;
  auVar87._0_4_ = fVar204 * 0.5 + fVar236 * 0.0;
  auVar87._4_4_ = fVar206 * 0.5 + fVar239 * 0.0;
  auVar87._8_4_ = fVar209 * 0.5 + fVar75 * 0.0;
  auVar87._12_4_ = fVar234 * 0.5 + fVar76 * 0.0;
  auVar122._0_4_ = fVar280 * 0.0;
  auVar122._4_4_ = fVar281 * 0.0;
  auVar122._8_4_ = fVar185 * 0.0;
  auVar122._12_4_ = fVar202 * 0.0;
  auVar96 = vsubps_avx(auVar87,auVar122);
  auVar123._0_4_ = *(float *)*pauVar4 * 0.5;
  auVar123._4_4_ = *(float *)(*pauVar4 + 4) * 0.5;
  auVar123._8_4_ = *(float *)(*pauVar4 + 8) * 0.5;
  auVar123._12_4_ = fVar279 * 0.5;
  auVar133 = vsubps_avx(auVar96,auVar123);
  auVar96 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar11);
  pfVar3 = (float *)(lVar12 + lVar11 * lVar2);
  fVar186 = *pfVar3;
  fVar203 = pfVar3[1];
  fVar205 = pfVar3[2];
  fVar207 = pfVar3[3];
  fVar338 = auVar96._0_4_;
  fVar301 = auVar96._4_4_;
  fVar345 = auVar96._8_4_;
  fVar302 = auVar96._12_4_;
  pfVar3 = (float *)(lVar12 + lVar69 * lVar11);
  fVar210 = *pfVar3;
  fVar235 = pfVar3[1];
  fVar237 = pfVar3[2];
  fVar240 = pfVar3[3];
  pfVar3 = (float *)(lVar12 + uVar67 * lVar11);
  fVar238 = *pfVar3;
  fVar241 = pfVar3[1];
  fVar116 = pfVar3[2];
  fVar117 = pfVar3[3];
  auVar218._0_4_ = fVar238 * 0.16666667 + fVar210 * 0.6666667 + fVar338 * 0.16666667 + fVar186 * 0.0
  ;
  auVar218._4_4_ = fVar241 * 0.16666667 + fVar235 * 0.6666667 + fVar301 * 0.16666667 + fVar203 * 0.0
  ;
  auVar218._8_4_ = fVar116 * 0.16666667 + fVar237 * 0.6666667 + fVar345 * 0.16666667 + fVar205 * 0.0
  ;
  auVar218._12_4_ =
       fVar117 * 0.16666667 + fVar240 * 0.6666667 + fVar302 * 0.16666667 + fVar207 * 0.0;
  auVar192._0_4_ = fVar338 * 0.5 + fVar186 * 0.0;
  auVar192._4_4_ = fVar301 * 0.5 + fVar203 * 0.0;
  auVar192._8_4_ = fVar345 * 0.5 + fVar205 * 0.0;
  auVar192._12_4_ = fVar302 * 0.5 + fVar207 * 0.0;
  auVar289._0_4_ = fVar210 * 0.0;
  auVar289._4_4_ = fVar235 * 0.0;
  auVar289._8_4_ = fVar237 * 0.0;
  auVar289._12_4_ = fVar240 * 0.0;
  auVar96 = vsubps_avx(auVar192,auVar289);
  auVar290._0_4_ = fVar238 * 0.5;
  auVar290._4_4_ = fVar241 * 0.5;
  auVar290._8_4_ = fVar116 * 0.5;
  auVar290._12_4_ = fVar117 * 0.5;
  auVar216 = vsubps_avx(auVar96,auVar290);
  auVar291._0_4_ = fVar204 * 0.0 + fVar236 * 0.5;
  auVar291._4_4_ = fVar206 * 0.0 + fVar239 * 0.5;
  auVar291._8_4_ = fVar209 * 0.0 + fVar75 * 0.5;
  auVar291._12_4_ = fVar234 * 0.0 + fVar76 * 0.5;
  auVar341._0_4_ = fVar280 * 0.5;
  auVar341._4_4_ = fVar281 * 0.5;
  auVar341._8_4_ = fVar185 * 0.5;
  auVar341._12_4_ = fVar202 * 0.5;
  auVar96 = vsubps_avx(auVar291,auVar341);
  local_6d0 = auVar55._0_4_;
  fStack_6cc = auVar55._4_4_;
  fStack_6c8 = auVar55._8_4_;
  auVar330._0_4_ = local_6d0 * 0.0;
  auVar330._4_4_ = fStack_6cc * 0.0;
  auVar330._8_4_ = fStack_6c8 * 0.0;
  auVar330._12_4_ = fVar279 * 0.0;
  auVar342._0_4_ =
       auVar330._0_4_ + fVar280 * 0.16666667 + fVar236 * 0.16666667 + fVar204 * 0.6666667;
  auVar342._4_4_ =
       auVar330._4_4_ + fVar281 * 0.16666667 + fVar239 * 0.16666667 + fVar206 * 0.6666667;
  auVar342._8_4_ = auVar330._8_4_ + fVar185 * 0.16666667 + fVar75 * 0.16666667 + fVar209 * 0.6666667
  ;
  auVar342._12_4_ =
       auVar330._12_4_ + fVar202 * 0.16666667 + fVar76 * 0.16666667 + fVar234 * 0.6666667;
  auVar17 = vsubps_avx(auVar96,auVar330);
  auVar157._0_4_ = fVar338 * 0.0 + fVar186 * 0.5;
  auVar157._4_4_ = fVar301 * 0.0 + fVar203 * 0.5;
  auVar157._8_4_ = fVar345 * 0.0 + fVar205 * 0.5;
  auVar157._12_4_ = fVar302 * 0.0 + fVar207 * 0.5;
  auVar88._0_4_ = fVar210 * 0.5;
  auVar88._4_4_ = fVar235 * 0.5;
  auVar88._8_4_ = fVar237 * 0.5;
  auVar88._12_4_ = fVar240 * 0.5;
  auVar96 = vsubps_avx(auVar157,auVar88);
  auVar124._0_4_ = fVar238 * 0.0;
  auVar124._4_4_ = fVar241 * 0.0;
  auVar124._8_4_ = fVar116 * 0.0;
  auVar124._12_4_ = fVar117 * 0.0;
  auVar158._0_4_ =
       auVar124._0_4_ + fVar210 * 0.16666667 + fVar338 * 0.6666667 + fVar186 * 0.16666667;
  auVar158._4_4_ =
       auVar124._4_4_ + fVar235 * 0.16666667 + fVar301 * 0.6666667 + fVar203 * 0.16666667;
  auVar158._8_4_ =
       auVar124._8_4_ + fVar237 * 0.16666667 + fVar345 * 0.6666667 + fVar205 * 0.16666667;
  auVar158._12_4_ =
       auVar124._12_4_ + fVar240 * 0.16666667 + fVar302 * 0.6666667 + fVar207 * 0.16666667;
  auVar181 = vsubps_avx(auVar96,auVar124);
  auVar96 = vshufps_avx(auVar218,auVar218,0xc9);
  fVar234 = auVar133._0_4_;
  auVar125._0_4_ = fVar234 * auVar96._0_4_;
  fVar236 = auVar133._4_4_;
  auVar125._4_4_ = fVar236 * auVar96._4_4_;
  fVar239 = auVar133._8_4_;
  auVar125._8_4_ = fVar239 * auVar96._8_4_;
  fVar76 = auVar133._12_4_;
  auVar125._12_4_ = fVar76 * auVar96._12_4_;
  auVar96 = vshufps_avx(auVar133,auVar133,0xc9);
  auVar219._0_4_ = auVar96._0_4_ * auVar218._0_4_;
  auVar219._4_4_ = auVar96._4_4_ * auVar218._4_4_;
  auVar219._8_4_ = auVar96._8_4_ * auVar218._8_4_;
  auVar219._12_4_ = auVar96._12_4_ * auVar218._12_4_;
  auVar288 = vsubps_avx(auVar219,auVar125);
  auVar126._0_4_ = auVar96._0_4_ * auVar216._0_4_;
  auVar126._4_4_ = auVar96._4_4_ * auVar216._4_4_;
  auVar126._8_4_ = auVar96._8_4_ * auVar216._8_4_;
  auVar126._12_4_ = auVar96._12_4_ * auVar216._12_4_;
  auVar96 = vshufps_avx(auVar216,auVar216,0xc9);
  auVar193._0_4_ = fVar234 * auVar96._0_4_;
  auVar193._4_4_ = fVar236 * auVar96._4_4_;
  auVar193._8_4_ = fVar239 * auVar96._8_4_;
  auVar193._12_4_ = fVar76 * auVar96._12_4_;
  auVar16 = vsubps_avx(auVar126,auVar193);
  auVar96 = vshufps_avx(auVar158,auVar158,0xc9);
  fVar75 = auVar17._0_4_;
  auVar127._0_4_ = fVar75 * auVar96._0_4_;
  fVar186 = auVar17._4_4_;
  auVar127._4_4_ = fVar186 * auVar96._4_4_;
  fVar203 = auVar17._8_4_;
  auVar127._8_4_ = fVar203 * auVar96._8_4_;
  fVar205 = auVar17._12_4_;
  auVar127._12_4_ = fVar205 * auVar96._12_4_;
  auVar96 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar159._0_4_ = auVar96._0_4_ * auVar158._0_4_;
  auVar159._4_4_ = auVar96._4_4_ * auVar158._4_4_;
  auVar159._8_4_ = auVar96._8_4_ * auVar158._8_4_;
  auVar159._12_4_ = auVar96._12_4_ * auVar158._12_4_;
  auVar15 = vsubps_avx(auVar159,auVar127);
  auVar160._0_4_ = auVar96._0_4_ * auVar181._0_4_;
  auVar160._4_4_ = auVar96._4_4_ * auVar181._4_4_;
  auVar160._8_4_ = auVar96._8_4_ * auVar181._8_4_;
  auVar160._12_4_ = auVar96._12_4_ * auVar181._12_4_;
  auVar96 = vshufps_avx(auVar181,auVar181,0xc9);
  auVar89._0_4_ = fVar75 * auVar96._0_4_;
  auVar89._4_4_ = fVar186 * auVar96._4_4_;
  auVar89._8_4_ = fVar203 * auVar96._8_4_;
  auVar89._12_4_ = fVar205 * auVar96._12_4_;
  auVar78 = vsubps_avx(auVar160,auVar89);
  auVar181 = vshufps_avx(auVar288,auVar288,0xc9);
  auVar96 = vdpps_avx(auVar181,auVar181,0x7f);
  fVar279 = auVar96._0_4_;
  auVar121 = ZEXT416((uint)fVar279);
  auVar216 = vrsqrtss_avx(auVar121,auVar121);
  fVar280 = auVar216._0_4_;
  auVar288 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar216 = vdpps_avx(auVar181,auVar288,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar194._0_4_ = auVar96._0_4_ * auVar288._0_4_;
  auVar194._4_4_ = auVar96._4_4_ * auVar288._4_4_;
  auVar194._8_4_ = auVar96._8_4_ * auVar288._8_4_;
  auVar194._12_4_ = auVar96._12_4_ * auVar288._12_4_;
  auVar96 = vshufps_avx(auVar216,auVar216,0);
  auVar352._0_4_ = auVar96._0_4_ * auVar181._0_4_;
  auVar352._4_4_ = auVar96._4_4_ * auVar181._4_4_;
  auVar352._8_4_ = auVar96._8_4_ * auVar181._8_4_;
  auVar352._12_4_ = auVar96._12_4_ * auVar181._12_4_;
  auVar79 = vsubps_avx(auVar194,auVar352);
  auVar96 = vrcpss_avx(auVar121,auVar121);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar279 * auVar96._0_4_)));
  auVar288 = vshufps_avx(auVar96,auVar96,0);
  auVar96 = ZEXT416((uint)(fVar280 * 1.5 - fVar279 * 0.5 * fVar280 * fVar280 * fVar280));
  auVar16 = vshufps_avx(auVar96,auVar96,0);
  fVar202 = auVar181._0_4_ * auVar16._0_4_;
  fVar204 = auVar181._4_4_ * auVar16._4_4_;
  fVar206 = auVar181._8_4_ * auVar16._8_4_;
  fVar209 = auVar181._12_4_ * auVar16._12_4_;
  auVar181 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar96 = vdpps_avx(auVar181,auVar181,0x7f);
  fVar279 = auVar96._0_4_;
  auVar121 = ZEXT416((uint)fVar279);
  auVar216 = vrsqrtss_avx(auVar121,auVar121);
  fVar280 = auVar216._0_4_;
  auVar15 = vshufps_avx(auVar78,auVar78,0xc9);
  auVar216 = vdpps_avx(auVar181,auVar15,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar90._0_4_ = auVar96._0_4_ * auVar15._0_4_;
  auVar90._4_4_ = auVar96._4_4_ * auVar15._4_4_;
  auVar90._8_4_ = auVar96._8_4_ * auVar15._8_4_;
  auVar90._12_4_ = auVar96._12_4_ * auVar15._12_4_;
  auVar96 = vshufps_avx(auVar216,auVar216,0);
  auVar292._0_4_ = auVar96._0_4_ * auVar181._0_4_;
  auVar292._4_4_ = auVar96._4_4_ * auVar181._4_4_;
  auVar292._8_4_ = auVar96._8_4_ * auVar181._8_4_;
  auVar292._12_4_ = auVar96._12_4_ * auVar181._12_4_;
  auVar78 = vsubps_avx(auVar90,auVar292);
  auVar96 = vrcpss_avx(auVar121,auVar121);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar279 * auVar96._0_4_)));
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar216 = ZEXT416((uint)(fVar280 * 1.5 - fVar279 * 0.5 * fVar280 * fVar280 * fVar280));
  auVar216 = vshufps_avx(auVar216,auVar216,0);
  fVar279 = auVar181._0_4_ * auVar216._0_4_;
  fVar280 = auVar181._4_4_ * auVar216._4_4_;
  fVar281 = auVar181._8_4_ * auVar216._8_4_;
  fVar185 = auVar181._12_4_ * auVar216._12_4_;
  auVar181 = vshufps_avx(auVar133,auVar133,0xff);
  auVar15 = vshufps_avx(_local_6c0,_local_6c0,0xff);
  auVar161._0_4_ = auVar15._0_4_ * fVar202;
  auVar161._4_4_ = auVar15._4_4_ * fVar204;
  auVar161._8_4_ = auVar15._8_4_ * fVar206;
  auVar161._12_4_ = auVar15._12_4_ * fVar209;
  auVar195._0_4_ =
       auVar181._0_4_ * fVar202 + auVar16._0_4_ * auVar79._0_4_ * auVar288._0_4_ * auVar15._0_4_;
  auVar195._4_4_ =
       auVar181._4_4_ * fVar204 + auVar16._4_4_ * auVar79._4_4_ * auVar288._4_4_ * auVar15._4_4_;
  auVar195._8_4_ =
       auVar181._8_4_ * fVar206 + auVar16._8_4_ * auVar79._8_4_ * auVar288._8_4_ * auVar15._8_4_;
  auVar195._12_4_ =
       auVar181._12_4_ * fVar209 +
       auVar16._12_4_ * auVar79._12_4_ * auVar288._12_4_ * auVar15._12_4_;
  auVar16 = vsubps_avx(_local_6c0,auVar161);
  local_6c0._0_4_ = (float)local_6c0._0_4_ + auVar161._0_4_;
  local_6c0._4_4_ = (float)local_6c0._4_4_ + auVar161._4_4_;
  fStack_6b8 = fStack_6b8 + auVar161._8_4_;
  fStack_6b4 = fStack_6b4 + auVar161._12_4_;
  auVar15 = vsubps_avx(auVar133,auVar195);
  auVar181 = vshufps_avx(auVar17,auVar17,0xff);
  auVar288 = vshufps_avx(auVar342,auVar342,0xff);
  auVar128._0_4_ = auVar288._0_4_ * fVar279;
  auVar128._4_4_ = auVar288._4_4_ * fVar280;
  auVar128._8_4_ = auVar288._8_4_ * fVar281;
  auVar128._12_4_ = auVar288._12_4_ * fVar185;
  auVar162._0_4_ =
       auVar181._0_4_ * fVar279 + auVar288._0_4_ * auVar216._0_4_ * auVar78._0_4_ * auVar96._0_4_;
  auVar162._4_4_ =
       auVar181._4_4_ * fVar280 + auVar288._4_4_ * auVar216._4_4_ * auVar78._4_4_ * auVar96._4_4_;
  auVar162._8_4_ =
       auVar181._8_4_ * fVar281 + auVar288._8_4_ * auVar216._8_4_ * auVar78._8_4_ * auVar96._8_4_;
  auVar162._12_4_ =
       auVar181._12_4_ * fVar185 +
       auVar288._12_4_ * auVar216._12_4_ * auVar78._12_4_ * auVar96._12_4_;
  auVar181 = vsubps_avx(auVar342,auVar128);
  auVar353._0_4_ = auVar342._0_4_ + auVar128._0_4_;
  auVar353._4_4_ = auVar342._4_4_ + auVar128._4_4_;
  auVar353._8_4_ = auVar342._8_4_ + auVar128._8_4_;
  auVar353._12_4_ = auVar342._12_4_ + auVar128._12_4_;
  auVar288 = vsubps_avx(auVar17,auVar162);
  local_620 = auVar144._0_4_;
  fStack_61c = auVar144._4_4_;
  fStack_618 = auVar144._8_4_;
  fStack_614 = auVar144._12_4_;
  local_600 = auVar267._0_4_;
  fStack_5fc = auVar267._4_4_;
  fStack_5f8 = auVar267._8_4_;
  fStack_5f4 = auVar267._12_4_;
  auVar96 = vshufps_avx(ZEXT416((uint)fVar268),ZEXT416((uint)fVar268),0);
  auVar216 = vshufps_avx(ZEXT416((uint)(1.0 - fVar268)),ZEXT416((uint)(1.0 - fVar268)),0);
  fVar185 = auVar96._0_4_;
  fVar202 = auVar96._4_4_;
  fVar204 = auVar96._8_4_;
  fVar206 = auVar96._12_4_;
  fVar268 = auVar216._0_4_;
  fVar279 = auVar216._4_4_;
  fVar280 = auVar216._8_4_;
  fVar281 = auVar216._12_4_;
  local_4a0._0_4_ = fVar268 * local_600 + fVar185 * auVar16._0_4_;
  local_4a0._4_4_ = fVar279 * fStack_5fc + fVar202 * auVar16._4_4_;
  fStack_498 = fVar280 * fStack_5f8 + fVar204 * auVar16._8_4_;
  fStack_494 = fVar281 * fStack_5f4 + fVar206 * auVar16._12_4_;
  fVar237 = (local_600 + local_620 * 0.33333334) * fVar268 +
            fVar185 * (auVar16._0_4_ + auVar15._0_4_ * 0.33333334);
  fVar240 = (fStack_5fc + fStack_61c * 0.33333334) * fVar279 +
            fVar202 * (auVar16._4_4_ + auVar15._4_4_ * 0.33333334);
  fVar238 = (fStack_5f8 + fStack_618 * 0.33333334) * fVar280 +
            fVar204 * (auVar16._8_4_ + auVar15._8_4_ * 0.33333334);
  fVar241 = (fStack_5f4 + fStack_614 * 0.33333334) * fVar281 +
            fVar206 * (auVar16._12_4_ + auVar15._12_4_ * 0.33333334);
  local_660 = auVar167._0_4_;
  fStack_65c = auVar167._4_4_;
  fStack_658 = auVar167._8_4_;
  fStack_654 = auVar167._12_4_;
  auVar220._0_4_ = local_660 * 0.33333334;
  auVar220._4_4_ = fStack_65c * 0.33333334;
  auVar220._8_4_ = fStack_658 * 0.33333334;
  auVar220._12_4_ = fStack_654 * 0.33333334;
  auVar96 = vsubps_avx(auVar132,auVar220);
  auVar259._0_4_ = (fVar282 + auVar86._0_4_) * 0.33333334;
  auVar259._4_4_ = (fVar283 + auVar86._4_4_) * 0.33333334;
  auVar259._8_4_ = (fVar299 + auVar86._8_4_) * 0.33333334;
  auVar259._12_4_ = (fVar300 + auVar86._12_4_) * 0.33333334;
  auVar216 = vsubps_avx(_local_6b0,auVar259);
  auVar293._0_4_ = auVar288._0_4_ * 0.33333334;
  auVar293._4_4_ = auVar288._4_4_ * 0.33333334;
  auVar293._8_4_ = auVar288._8_4_ * 0.33333334;
  auVar293._12_4_ = auVar288._12_4_ * 0.33333334;
  auVar288 = vsubps_avx(auVar181,auVar293);
  auVar163._0_4_ = (fVar75 + auVar162._0_4_) * 0.33333334;
  auVar163._4_4_ = (fVar186 + auVar162._4_4_) * 0.33333334;
  auVar163._8_4_ = (fVar203 + auVar162._8_4_) * 0.33333334;
  auVar163._12_4_ = (fVar205 + auVar162._12_4_) * 0.33333334;
  auVar16 = vsubps_avx(auVar353,auVar163);
  local_4b0._0_4_ = auVar288._0_4_ * fVar185 + fVar268 * auVar96._0_4_;
  local_4b0._4_4_ = auVar288._4_4_ * fVar202 + fVar279 * auVar96._4_4_;
  fStack_4a8 = auVar288._8_4_ * fVar204 + fVar280 * auVar96._8_4_;
  fStack_4a4 = auVar288._12_4_ * fVar206 + fVar281 * auVar96._12_4_;
  fVar75 = fVar268 * auVar132._0_4_ + fVar185 * auVar181._0_4_;
  fVar186 = fVar279 * auVar132._4_4_ + fVar202 * auVar181._4_4_;
  fVar205 = fVar280 * auVar132._8_4_ + fVar204 * auVar181._8_4_;
  fVar210 = fVar281 * auVar132._12_4_ + fVar206 * auVar181._12_4_;
  local_4c0._0_4_ = (float)local_700._0_4_ * fVar268 + fVar185 * (float)local_6c0._0_4_;
  local_4c0._4_4_ = (float)local_700._4_4_ * fVar279 + fVar202 * (float)local_6c0._4_4_;
  fStack_4b8 = fStack_6f8 * fVar280 + fVar204 * fStack_6b8;
  fStack_4b4 = fStack_6f4 * fVar281 + fVar206 * fStack_6b4;
  local_4d0._0_4_ =
       ((float)local_700._0_4_ + (fVar118 + auVar217._0_4_) * 0.33333334) * fVar268 +
       ((fVar234 + auVar195._0_4_) * 0.33333334 + (float)local_6c0._0_4_) * fVar185;
  local_4d0._4_4_ =
       ((float)local_700._4_4_ + (fVar119 + auVar217._4_4_) * 0.33333334) * fVar279 +
       ((fVar236 + auVar195._4_4_) * 0.33333334 + (float)local_6c0._4_4_) * fVar202;
  fStack_4c8 = (fStack_6f8 + (fVar208 + auVar217._8_4_) * 0.33333334) * fVar280 +
               ((fVar239 + auVar195._8_4_) * 0.33333334 + fStack_6b8) * fVar204;
  fStack_4c4 = (fStack_6f4 + (fVar255 + auVar217._12_4_) * 0.33333334) * fVar281 +
               ((fVar76 + auVar195._12_4_) * 0.33333334 + fStack_6b4) * fVar206;
  fVar76 = fVar268 * auVar216._0_4_ + fVar185 * auVar16._0_4_;
  fVar203 = fVar279 * auVar216._4_4_ + fVar202 * auVar16._4_4_;
  fVar207 = fVar280 * auVar216._8_4_ + fVar204 * auVar16._8_4_;
  fVar235 = fVar281 * auVar216._12_4_ + fVar206 * auVar16._12_4_;
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  local_430._0_4_ = (auVar258._0_4_ + auVar156._0_4_) * fVar268 + auVar353._0_4_ * fVar185;
  local_430._4_4_ = (auVar258._4_4_ + auVar156._4_4_) * fVar279 + auVar353._4_4_ * fVar202;
  fStack_428 = (auVar258._8_4_ + auVar156._8_4_) * fVar280 + auVar353._8_4_ * fVar204;
  fStack_424 = (auVar258._12_4_ + auVar156._12_4_) * fVar281 + auVar353._12_4_ * fVar206;
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_3a0 = vsubps_avx(_local_4a0,auVar96);
  auVar181 = vmovsldup_avx(local_3a0);
  auVar216 = vmovshdup_avx(local_3a0);
  auVar288 = vshufps_avx(local_3a0,local_3a0,0xaa);
  fVar268 = pre->ray_space[k].vx.field_0.m128[0];
  fVar279 = pre->ray_space[k].vx.field_0.m128[1];
  fVar280 = pre->ray_space[k].vx.field_0.m128[2];
  fVar281 = pre->ray_space[k].vx.field_0.m128[3];
  fVar185 = pre->ray_space[k].vy.field_0.m128[0];
  fVar202 = pre->ray_space[k].vy.field_0.m128[1];
  fVar204 = pre->ray_space[k].vy.field_0.m128[2];
  fVar206 = pre->ray_space[k].vy.field_0.m128[3];
  fVar209 = pre->ray_space[k].vz.field_0.m128[0];
  fVar234 = pre->ray_space[k].vz.field_0.m128[1];
  fVar236 = pre->ray_space[k].vz.field_0.m128[2];
  fVar239 = pre->ray_space[k].vz.field_0.m128[3];
  auVar359._0_4_ = fVar268 * auVar181._0_4_ + fVar185 * auVar216._0_4_ + fVar209 * auVar288._0_4_;
  auVar359._4_4_ = fVar279 * auVar181._4_4_ + fVar202 * auVar216._4_4_ + fVar234 * auVar288._4_4_;
  auVar359._8_4_ = fVar280 * auVar181._8_4_ + fVar204 * auVar216._8_4_ + fVar236 * auVar288._8_4_;
  auVar359._12_4_ =
       fVar281 * auVar181._12_4_ + fVar206 * auVar216._12_4_ + fVar239 * auVar288._12_4_;
  auVar62._4_4_ = fVar240;
  auVar62._0_4_ = fVar237;
  auVar62._8_4_ = fVar238;
  auVar62._12_4_ = fVar241;
  local_3b0 = vsubps_avx(auVar62,auVar96);
  auVar288 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar216 = vmovshdup_avx(local_3b0);
  auVar181 = vmovsldup_avx(local_3b0);
  auVar354._0_4_ = fVar268 * auVar181._0_4_ + fVar185 * auVar216._0_4_ + fVar209 * auVar288._0_4_;
  auVar354._4_4_ = fVar279 * auVar181._4_4_ + fVar202 * auVar216._4_4_ + fVar234 * auVar288._4_4_;
  auVar354._8_4_ = fVar280 * auVar181._8_4_ + fVar204 * auVar216._8_4_ + fVar236 * auVar288._8_4_;
  auVar354._12_4_ =
       fVar281 * auVar181._12_4_ + fVar206 * auVar216._12_4_ + fVar239 * auVar288._12_4_;
  local_3c0 = vsubps_avx(_local_4b0,auVar96);
  auVar288 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar216 = vmovshdup_avx(local_3c0);
  auVar181 = vmovsldup_avx(local_3c0);
  auVar196._0_4_ = fVar268 * auVar181._0_4_ + fVar185 * auVar216._0_4_ + fVar209 * auVar288._0_4_;
  auVar196._4_4_ = fVar279 * auVar181._4_4_ + fVar202 * auVar216._4_4_ + fVar234 * auVar288._4_4_;
  auVar196._8_4_ = fVar280 * auVar181._8_4_ + fVar204 * auVar216._8_4_ + fVar236 * auVar288._8_4_;
  auVar196._12_4_ =
       fVar281 * auVar181._12_4_ + fVar206 * auVar216._12_4_ + fVar239 * auVar288._12_4_;
  auVar60._4_4_ = fVar186;
  auVar60._0_4_ = fVar75;
  auVar60._8_4_ = fVar205;
  auVar60._12_4_ = fVar210;
  local_3d0 = vsubps_avx(auVar60,auVar96);
  auVar288 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar216 = vmovshdup_avx(local_3d0);
  auVar181 = vmovsldup_avx(local_3d0);
  auVar129._0_4_ = auVar181._0_4_ * fVar268 + auVar216._0_4_ * fVar185 + fVar209 * auVar288._0_4_;
  auVar129._4_4_ = auVar181._4_4_ * fVar279 + auVar216._4_4_ * fVar202 + fVar234 * auVar288._4_4_;
  auVar129._8_4_ = auVar181._8_4_ * fVar280 + auVar216._8_4_ * fVar204 + fVar236 * auVar288._8_4_;
  auVar129._12_4_ =
       auVar181._12_4_ * fVar281 + auVar216._12_4_ * fVar206 + fVar239 * auVar288._12_4_;
  local_3e0 = vsubps_avx(_local_4c0,auVar96);
  auVar288 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar216 = vmovshdup_avx(local_3e0);
  auVar181 = vmovsldup_avx(local_3e0);
  auVar294._0_4_ = auVar181._0_4_ * fVar268 + auVar216._0_4_ * fVar185 + auVar288._0_4_ * fVar209;
  auVar294._4_4_ = auVar181._4_4_ * fVar279 + auVar216._4_4_ * fVar202 + auVar288._4_4_ * fVar234;
  auVar294._8_4_ = auVar181._8_4_ * fVar280 + auVar216._8_4_ * fVar204 + auVar288._8_4_ * fVar236;
  auVar294._12_4_ =
       auVar181._12_4_ * fVar281 + auVar216._12_4_ * fVar206 + auVar288._12_4_ * fVar239;
  local_3f0 = vsubps_avx(_local_4d0,auVar96);
  auVar288 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar216 = vmovshdup_avx(local_3f0);
  auVar181 = vmovsldup_avx(local_3f0);
  auVar306._0_4_ = auVar181._0_4_ * fVar268 + auVar216._0_4_ * fVar185 + auVar288._0_4_ * fVar209;
  auVar306._4_4_ = auVar181._4_4_ * fVar279 + auVar216._4_4_ * fVar202 + auVar288._4_4_ * fVar234;
  auVar306._8_4_ = auVar181._8_4_ * fVar280 + auVar216._8_4_ * fVar204 + auVar288._8_4_ * fVar236;
  auVar306._12_4_ =
       auVar181._12_4_ * fVar281 + auVar216._12_4_ * fVar206 + auVar288._12_4_ * fVar239;
  auVar58._4_4_ = fVar203;
  auVar58._0_4_ = fVar76;
  auVar58._8_4_ = fVar207;
  auVar58._12_4_ = fVar235;
  local_400 = vsubps_avx(auVar58,auVar96);
  auVar288 = vshufps_avx(local_400,local_400,0xaa);
  auVar216 = vmovshdup_avx(local_400);
  auVar181 = vmovsldup_avx(local_400);
  auVar322._0_4_ = auVar181._0_4_ * fVar268 + auVar216._0_4_ * fVar185 + auVar288._0_4_ * fVar209;
  auVar322._4_4_ = auVar181._4_4_ * fVar279 + auVar216._4_4_ * fVar202 + auVar288._4_4_ * fVar234;
  auVar322._8_4_ = auVar181._8_4_ * fVar280 + auVar216._8_4_ * fVar204 + auVar288._8_4_ * fVar236;
  auVar322._12_4_ =
       auVar181._12_4_ * fVar281 + auVar216._12_4_ * fVar206 + auVar288._12_4_ * fVar239;
  local_410 = vsubps_avx(_local_430,auVar96);
  auVar181 = vshufps_avx(local_410,local_410,0xaa);
  auVar96 = vmovshdup_avx(local_410);
  auVar216 = vmovsldup_avx(local_410);
  auVar91._0_4_ = fVar268 * auVar216._0_4_ + fVar185 * auVar96._0_4_ + fVar209 * auVar181._0_4_;
  auVar91._4_4_ = fVar279 * auVar216._4_4_ + fVar202 * auVar96._4_4_ + fVar234 * auVar181._4_4_;
  auVar91._8_4_ = fVar280 * auVar216._8_4_ + fVar204 * auVar96._8_4_ + fVar236 * auVar181._8_4_;
  auVar91._12_4_ = fVar281 * auVar216._12_4_ + fVar206 * auVar96._12_4_ + fVar239 * auVar181._12_4_;
  auVar288 = vmovlhps_avx(auVar359,auVar294);
  auVar16 = vmovlhps_avx(auVar354,auVar306);
  auVar15 = vmovlhps_avx(auVar196,auVar322);
  _local_380 = vmovlhps_avx(auVar129,auVar91);
  auVar96 = vminps_avx(auVar288,auVar16);
  auVar216 = vminps_avx(auVar15,_local_380);
  auVar181 = vminps_avx(auVar96,auVar216);
  auVar96 = vmaxps_avx(auVar288,auVar16);
  auVar216 = vmaxps_avx(auVar15,_local_380);
  auVar96 = vmaxps_avx(auVar96,auVar216);
  auVar216 = vshufpd_avx(auVar181,auVar181,3);
  auVar181 = vminps_avx(auVar181,auVar216);
  auVar216 = vshufpd_avx(auVar96,auVar96,3);
  auVar216 = vmaxps_avx(auVar96,auVar216);
  auVar260._8_4_ = 0x7fffffff;
  auVar260._0_8_ = 0x7fffffff7fffffff;
  auVar260._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar181,auVar260);
  auVar216 = vandps_avx(auVar216,auVar260);
  auVar96 = vmaxps_avx(auVar96,auVar216);
  auVar216 = vmovshdup_avx(auVar96);
  auVar96 = vmaxss_avx(auVar216,auVar96);
  fVar268 = auVar96._0_4_ * 9.536743e-07;
  local_390 = ZEXT416((uint)fVar268);
  auVar96 = vshufps_avx(ZEXT416((uint)fVar268),ZEXT416((uint)fVar268),0);
  local_1c0._16_16_ = auVar96;
  local_1c0._0_16_ = auVar96;
  auVar92._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
  auVar92._8_4_ = auVar96._8_4_ ^ 0x80000000;
  auVar92._12_4_ = auVar96._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar92;
  local_1e0._0_16_ = auVar92;
  auVar96 = vpshufd_avx(ZEXT416(uVar65),0);
  local_300._16_16_ = auVar96;
  local_300._0_16_ = auVar96;
  auVar96 = vpshufd_avx(ZEXT416(uVar8),0);
  local_320._16_16_ = auVar96;
  local_320._0_16_ = auVar96;
  uVar67 = 0;
  fVar268 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar16,auVar288);
  _local_360 = vsubps_avx(auVar15,auVar16);
  _local_370 = vsubps_avx(_local_380,auVar15);
  _local_440 = vsubps_avx(_local_4c0,_local_4a0);
  auVar63._4_4_ = fVar240;
  auVar63._0_4_ = fVar237;
  auVar63._8_4_ = fVar238;
  auVar63._12_4_ = fVar241;
  _local_450 = vsubps_avx(_local_4d0,auVar63);
  auVar59._4_4_ = fVar203;
  auVar59._0_4_ = fVar76;
  auVar59._8_4_ = fVar207;
  auVar59._12_4_ = fVar235;
  _local_460 = vsubps_avx(auVar59,_local_4b0);
  auVar61._4_4_ = fVar186;
  auVar61._0_4_ = fVar75;
  auVar61._8_4_ = fVar205;
  auVar61._12_4_ = fVar210;
  _local_470 = vsubps_avx(_local_430,auVar61);
  auVar337 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar366 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_008ed6f4:
  do {
    local_420 = auVar366._0_16_;
    auVar79 = auVar337._0_16_;
    auVar96 = vshufps_avx(auVar79,auVar79,0x50);
    auVar360._8_4_ = 0x3f800000;
    auVar360._0_8_ = 0x3f8000003f800000;
    auVar360._12_4_ = 0x3f800000;
    auVar363._16_4_ = 0x3f800000;
    auVar363._0_16_ = auVar360;
    auVar363._20_4_ = 0x3f800000;
    auVar363._24_4_ = 0x3f800000;
    auVar363._28_4_ = 0x3f800000;
    auVar216 = vsubps_avx(auVar360,auVar96);
    fVar279 = auVar96._0_4_;
    fVar280 = auVar96._4_4_;
    fVar281 = auVar96._8_4_;
    fVar185 = auVar96._12_4_;
    fVar202 = auVar216._0_4_;
    fVar204 = auVar216._4_4_;
    fVar206 = auVar216._8_4_;
    fVar209 = auVar216._12_4_;
    auVar197._0_4_ = auVar294._0_4_ * fVar279 + fVar202 * auVar359._0_4_;
    auVar197._4_4_ = auVar294._4_4_ * fVar280 + fVar204 * auVar359._4_4_;
    auVar197._8_4_ = auVar294._0_4_ * fVar281 + fVar206 * auVar359._0_4_;
    auVar197._12_4_ = auVar294._4_4_ * fVar185 + fVar209 * auVar359._4_4_;
    auVar164._0_4_ = auVar306._0_4_ * fVar279 + auVar354._0_4_ * fVar202;
    auVar164._4_4_ = auVar306._4_4_ * fVar280 + auVar354._4_4_ * fVar204;
    auVar164._8_4_ = auVar306._0_4_ * fVar281 + auVar354._0_4_ * fVar206;
    auVar164._12_4_ = auVar306._4_4_ * fVar185 + auVar354._4_4_ * fVar209;
    auVar275._0_4_ = auVar322._0_4_ * fVar279 + auVar196._0_4_ * fVar202;
    auVar275._4_4_ = auVar322._4_4_ * fVar280 + auVar196._4_4_ * fVar204;
    auVar275._8_4_ = auVar322._0_4_ * fVar281 + auVar196._0_4_ * fVar206;
    auVar275._12_4_ = auVar322._4_4_ * fVar185 + auVar196._4_4_ * fVar209;
    auVar221._0_4_ = auVar91._0_4_ * fVar279 + auVar129._0_4_ * fVar202;
    auVar221._4_4_ = auVar91._4_4_ * fVar280 + auVar129._4_4_ * fVar204;
    auVar221._8_4_ = auVar91._0_4_ * fVar281 + auVar129._0_4_ * fVar206;
    auVar221._12_4_ = auVar91._4_4_ * fVar185 + auVar129._4_4_ * fVar209;
    auVar96 = vmovshdup_avx(local_420);
    auVar216 = vshufps_avx(local_420,local_420,0);
    auVar310._16_16_ = auVar216;
    auVar310._0_16_ = auVar216;
    auVar181 = vshufps_avx(local_420,local_420,0x55);
    auVar109._16_16_ = auVar181;
    auVar109._0_16_ = auVar181;
    auVar108 = vsubps_avx(auVar109,auVar310);
    auVar181 = vshufps_avx(auVar197,auVar197,0);
    auVar144 = vshufps_avx(auVar197,auVar197,0x55);
    auVar132 = vshufps_avx(auVar164,auVar164,0);
    auVar167 = vshufps_avx(auVar164,auVar164,0x55);
    auVar133 = vshufps_avx(auVar275,auVar275,0);
    auVar267 = vshufps_avx(auVar275,auVar275,0x55);
    auVar17 = vshufps_avx(auVar221,auVar221,0);
    auVar78 = vshufps_avx(auVar221,auVar221,0x55);
    auVar96 = ZEXT416((uint)((auVar96._0_4_ - auVar366._0_4_) * 0.04761905));
    auVar96 = vshufps_avx(auVar96,auVar96,0);
    auVar326._0_4_ = auVar216._0_4_ + auVar108._0_4_ * 0.0;
    auVar326._4_4_ = auVar216._4_4_ + auVar108._4_4_ * 0.14285715;
    auVar326._8_4_ = auVar216._8_4_ + auVar108._8_4_ * 0.2857143;
    auVar326._12_4_ = auVar216._12_4_ + auVar108._12_4_ * 0.42857146;
    auVar326._16_4_ = auVar216._0_4_ + auVar108._16_4_ * 0.5714286;
    auVar326._20_4_ = auVar216._4_4_ + auVar108._20_4_ * 0.71428573;
    auVar326._24_4_ = auVar216._8_4_ + auVar108._24_4_ * 0.8571429;
    auVar326._28_4_ = auVar216._12_4_ + auVar108._28_4_;
    auVar18 = vsubps_avx(auVar363,auVar326);
    fVar279 = auVar132._0_4_;
    fVar281 = auVar132._4_4_;
    fVar202 = auVar132._8_4_;
    fVar206 = auVar132._12_4_;
    fVar304 = auVar18._0_4_;
    fVar312 = auVar18._4_4_;
    fVar313 = auVar18._8_4_;
    fVar314 = auVar18._12_4_;
    fVar315 = auVar18._16_4_;
    fVar316 = auVar18._20_4_;
    fVar317 = auVar18._24_4_;
    fVar300 = auVar167._0_4_;
    fVar301 = auVar167._4_4_;
    fVar302 = auVar167._8_4_;
    fVar303 = auVar167._12_4_;
    fVar356 = auVar144._12_4_ + 1.0;
    fVar255 = auVar133._0_4_;
    fVar282 = auVar133._4_4_;
    fVar283 = auVar133._8_4_;
    fVar299 = auVar133._12_4_;
    fVar234 = fVar255 * auVar326._0_4_ + fVar304 * fVar279;
    fVar236 = fVar282 * auVar326._4_4_ + fVar312 * fVar281;
    fVar239 = fVar283 * auVar326._8_4_ + fVar313 * fVar202;
    fVar116 = fVar299 * auVar326._12_4_ + fVar314 * fVar206;
    fVar117 = fVar255 * auVar326._16_4_ + fVar315 * fVar279;
    fVar118 = fVar282 * auVar326._20_4_ + fVar316 * fVar281;
    fVar119 = fVar283 * auVar326._24_4_ + fVar317 * fVar202;
    fVar280 = auVar267._0_4_;
    fVar185 = auVar267._4_4_;
    fVar204 = auVar267._8_4_;
    fVar209 = auVar267._12_4_;
    fVar338 = fVar300 * fVar304 + auVar326._0_4_ * fVar280;
    fVar345 = fVar301 * fVar312 + auVar326._4_4_ * fVar185;
    fVar346 = fVar302 * fVar313 + auVar326._8_4_ * fVar204;
    fVar347 = fVar303 * fVar314 + auVar326._12_4_ * fVar209;
    fVar348 = fVar300 * fVar315 + auVar326._16_4_ * fVar280;
    fVar349 = fVar301 * fVar316 + auVar326._20_4_ * fVar185;
    fVar350 = fVar302 * fVar317 + auVar326._24_4_ * fVar204;
    fVar351 = fVar303 + fVar206;
    auVar216 = vshufps_avx(auVar197,auVar197,0xaa);
    auVar132 = vshufps_avx(auVar197,auVar197,0xff);
    fVar208 = fVar299 + 0.0;
    auVar167 = vshufps_avx(auVar164,auVar164,0xaa);
    auVar133 = vshufps_avx(auVar164,auVar164,0xff);
    auVar232._0_4_ =
         fVar304 * (auVar326._0_4_ * fVar279 + fVar304 * auVar181._0_4_) + auVar326._0_4_ * fVar234;
    auVar232._4_4_ =
         fVar312 * (auVar326._4_4_ * fVar281 + fVar312 * auVar181._4_4_) + auVar326._4_4_ * fVar236;
    auVar232._8_4_ =
         fVar313 * (auVar326._8_4_ * fVar202 + fVar313 * auVar181._8_4_) + auVar326._8_4_ * fVar239;
    auVar232._12_4_ =
         fVar314 * (auVar326._12_4_ * fVar206 + fVar314 * auVar181._12_4_) +
         auVar326._12_4_ * fVar116;
    auVar232._16_4_ =
         fVar315 * (auVar326._16_4_ * fVar279 + fVar315 * auVar181._0_4_) +
         auVar326._16_4_ * fVar117;
    auVar232._20_4_ =
         fVar316 * (auVar326._20_4_ * fVar281 + fVar316 * auVar181._4_4_) +
         auVar326._20_4_ * fVar118;
    auVar232._24_4_ =
         fVar317 * (auVar326._24_4_ * fVar202 + fVar317 * auVar181._8_4_) +
         auVar326._24_4_ * fVar119;
    auVar232._28_4_ = auVar181._12_4_ + 1.0 + fVar209;
    auVar253._0_4_ =
         fVar304 * (fVar300 * auVar326._0_4_ + auVar144._0_4_ * fVar304) + auVar326._0_4_ * fVar338;
    auVar253._4_4_ =
         fVar312 * (fVar301 * auVar326._4_4_ + auVar144._4_4_ * fVar312) + auVar326._4_4_ * fVar345;
    auVar253._8_4_ =
         fVar313 * (fVar302 * auVar326._8_4_ + auVar144._8_4_ * fVar313) + auVar326._8_4_ * fVar346;
    auVar253._12_4_ =
         fVar314 * (fVar303 * auVar326._12_4_ + auVar144._12_4_ * fVar314) +
         auVar326._12_4_ * fVar347;
    auVar253._16_4_ =
         fVar315 * (fVar300 * auVar326._16_4_ + auVar144._0_4_ * fVar315) +
         auVar326._16_4_ * fVar348;
    auVar253._20_4_ =
         fVar316 * (fVar301 * auVar326._20_4_ + auVar144._4_4_ * fVar316) +
         auVar326._20_4_ * fVar349;
    auVar253._24_4_ =
         fVar317 * (fVar302 * auVar326._24_4_ + auVar144._8_4_ * fVar317) +
         auVar326._24_4_ * fVar350;
    auVar253._28_4_ = auVar78._12_4_ + fVar209;
    auVar110._0_4_ =
         fVar304 * fVar234 + auVar326._0_4_ * (fVar255 * fVar304 + auVar17._0_4_ * auVar326._0_4_);
    auVar110._4_4_ =
         fVar312 * fVar236 + auVar326._4_4_ * (fVar282 * fVar312 + auVar17._4_4_ * auVar326._4_4_);
    auVar110._8_4_ =
         fVar313 * fVar239 + auVar326._8_4_ * (fVar283 * fVar313 + auVar17._8_4_ * auVar326._8_4_);
    auVar110._12_4_ =
         fVar314 * fVar116 +
         auVar326._12_4_ * (fVar299 * fVar314 + auVar17._12_4_ * auVar326._12_4_);
    auVar110._16_4_ =
         fVar315 * fVar117 + auVar326._16_4_ * (fVar255 * fVar315 + auVar17._0_4_ * auVar326._16_4_)
    ;
    auVar110._20_4_ =
         fVar316 * fVar118 + auVar326._20_4_ * (fVar282 * fVar316 + auVar17._4_4_ * auVar326._20_4_)
    ;
    auVar110._24_4_ =
         fVar317 * fVar119 + auVar326._24_4_ * (fVar283 * fVar317 + auVar17._8_4_ * auVar326._24_4_)
    ;
    auVar110._28_4_ = fVar206 + 1.0 + fVar208;
    auVar336._0_4_ =
         fVar304 * fVar338 + auVar326._0_4_ * (auVar78._0_4_ * auVar326._0_4_ + fVar304 * fVar280);
    auVar336._4_4_ =
         fVar312 * fVar345 + auVar326._4_4_ * (auVar78._4_4_ * auVar326._4_4_ + fVar312 * fVar185);
    auVar336._8_4_ =
         fVar313 * fVar346 + auVar326._8_4_ * (auVar78._8_4_ * auVar326._8_4_ + fVar313 * fVar204);
    auVar336._12_4_ =
         fVar314 * fVar347 +
         auVar326._12_4_ * (auVar78._12_4_ * auVar326._12_4_ + fVar314 * fVar209);
    auVar336._16_4_ =
         fVar315 * fVar348 + auVar326._16_4_ * (auVar78._0_4_ * auVar326._16_4_ + fVar315 * fVar280)
    ;
    auVar336._20_4_ =
         fVar316 * fVar349 + auVar326._20_4_ * (auVar78._4_4_ * auVar326._20_4_ + fVar316 * fVar185)
    ;
    auVar336._24_4_ =
         fVar317 * fVar350 + auVar326._24_4_ * (auVar78._8_4_ * auVar326._24_4_ + fVar317 * fVar204)
    ;
    auVar336._28_4_ = fVar208 + fVar209 + 0.0;
    local_220._0_4_ = fVar304 * auVar232._0_4_ + auVar326._0_4_ * auVar110._0_4_;
    local_220._4_4_ = fVar312 * auVar232._4_4_ + auVar326._4_4_ * auVar110._4_4_;
    local_220._8_4_ = fVar313 * auVar232._8_4_ + auVar326._8_4_ * auVar110._8_4_;
    local_220._12_4_ = fVar314 * auVar232._12_4_ + auVar326._12_4_ * auVar110._12_4_;
    local_220._16_4_ = fVar315 * auVar232._16_4_ + auVar326._16_4_ * auVar110._16_4_;
    local_220._20_4_ = fVar316 * auVar232._20_4_ + auVar326._20_4_ * auVar110._20_4_;
    local_220._24_4_ = fVar317 * auVar232._24_4_ + auVar326._24_4_ * auVar110._24_4_;
    local_220._28_4_ = fVar351 + fVar209 + 0.0;
    auVar201._0_4_ = fVar304 * auVar253._0_4_ + auVar326._0_4_ * auVar336._0_4_;
    auVar201._4_4_ = fVar312 * auVar253._4_4_ + auVar326._4_4_ * auVar336._4_4_;
    auVar201._8_4_ = fVar313 * auVar253._8_4_ + auVar326._8_4_ * auVar336._8_4_;
    auVar201._12_4_ = fVar314 * auVar253._12_4_ + auVar326._12_4_ * auVar336._12_4_;
    auVar201._16_4_ = fVar315 * auVar253._16_4_ + auVar326._16_4_ * auVar336._16_4_;
    auVar201._20_4_ = fVar316 * auVar253._20_4_ + auVar326._20_4_ * auVar336._20_4_;
    auVar201._24_4_ = fVar317 * auVar253._24_4_ + auVar326._24_4_ * auVar336._24_4_;
    auVar201._28_4_ = fVar351 + fVar208;
    auVar19 = vsubps_avx(auVar110,auVar232);
    auVar108 = vsubps_avx(auVar336,auVar253);
    local_620 = auVar96._0_4_;
    fStack_61c = auVar96._4_4_;
    fStack_618 = auVar96._8_4_;
    fStack_614 = auVar96._12_4_;
    local_260 = local_620 * auVar19._0_4_ * 3.0;
    fStack_25c = fStack_61c * auVar19._4_4_ * 3.0;
    auVar20._4_4_ = fStack_25c;
    auVar20._0_4_ = local_260;
    fStack_258 = fStack_618 * auVar19._8_4_ * 3.0;
    auVar20._8_4_ = fStack_258;
    fStack_254 = fStack_614 * auVar19._12_4_ * 3.0;
    auVar20._12_4_ = fStack_254;
    fStack_250 = local_620 * auVar19._16_4_ * 3.0;
    auVar20._16_4_ = fStack_250;
    fStack_24c = fStack_61c * auVar19._20_4_ * 3.0;
    auVar20._20_4_ = fStack_24c;
    fStack_248 = fStack_618 * auVar19._24_4_ * 3.0;
    auVar20._24_4_ = fStack_248;
    auVar20._28_4_ = auVar19._28_4_;
    local_280 = local_620 * auVar108._0_4_ * 3.0;
    fStack_27c = fStack_61c * auVar108._4_4_ * 3.0;
    auVar21._4_4_ = fStack_27c;
    auVar21._0_4_ = local_280;
    fStack_278 = fStack_618 * auVar108._8_4_ * 3.0;
    auVar21._8_4_ = fStack_278;
    fStack_274 = fStack_614 * auVar108._12_4_ * 3.0;
    auVar21._12_4_ = fStack_274;
    fStack_270 = local_620 * auVar108._16_4_ * 3.0;
    auVar21._16_4_ = fStack_270;
    fStack_26c = fStack_61c * auVar108._20_4_ * 3.0;
    auVar21._20_4_ = fStack_26c;
    fStack_268 = fStack_618 * auVar108._24_4_ * 3.0;
    auVar21._24_4_ = fStack_268;
    auVar21._28_4_ = fVar351;
    auVar20 = vsubps_avx(local_220,auVar20);
    auVar108 = vperm2f128_avx(auVar20,auVar20,1);
    auVar108 = vshufps_avx(auVar108,auVar20,0x30);
    auVar108 = vshufps_avx(auVar20,auVar108,0x29);
    auVar21 = vsubps_avx(auVar201,auVar21);
    auVar20 = vperm2f128_avx(auVar21,auVar21,1);
    auVar20 = vshufps_avx(auVar20,auVar21,0x30);
    auVar21 = vshufps_avx(auVar21,auVar20,0x29);
    fVar349 = auVar167._0_4_;
    fVar350 = auVar167._4_4_;
    fVar367 = auVar167._8_4_;
    fVar206 = auVar216._12_4_;
    fVar282 = auVar133._0_4_;
    fVar299 = auVar133._4_4_;
    fVar338 = auVar133._8_4_;
    fVar345 = auVar133._12_4_;
    auVar96 = vshufps_avx(auVar275,auVar275,0xaa);
    fVar279 = auVar96._0_4_;
    fVar281 = auVar96._4_4_;
    fVar202 = auVar96._8_4_;
    fVar209 = auVar96._12_4_;
    fVar239 = auVar326._0_4_ * fVar279 + fVar349 * fVar304;
    fVar116 = auVar326._4_4_ * fVar281 + fVar350 * fVar312;
    fVar117 = auVar326._8_4_ * fVar202 + fVar367 * fVar313;
    fVar118 = auVar326._12_4_ * fVar209 + auVar167._12_4_ * fVar314;
    fVar119 = auVar326._16_4_ * fVar279 + fVar349 * fVar315;
    fVar208 = auVar326._20_4_ * fVar281 + fVar350 * fVar316;
    fVar255 = auVar326._24_4_ * fVar202 + fVar367 * fVar317;
    auVar96 = vshufps_avx(auVar275,auVar275,0xff);
    fVar280 = auVar96._0_4_;
    fVar185 = auVar96._4_4_;
    fVar204 = auVar96._8_4_;
    fVar234 = auVar96._12_4_;
    fVar283 = auVar326._0_4_ * fVar280 + fVar282 * fVar304;
    fVar300 = auVar326._4_4_ * fVar185 + fVar299 * fVar312;
    fVar301 = auVar326._8_4_ * fVar204 + fVar338 * fVar313;
    fVar302 = auVar326._12_4_ * fVar234 + fVar345 * fVar314;
    fVar346 = auVar326._16_4_ * fVar280 + fVar282 * fVar315;
    fVar303 = auVar326._20_4_ * fVar185 + fVar299 * fVar316;
    fVar347 = auVar326._24_4_ * fVar204 + fVar338 * fVar317;
    auVar96 = vshufps_avx(auVar221,auVar221,0xaa);
    fVar348 = auVar96._12_4_ + fVar209;
    auVar181 = vshufps_avx(auVar221,auVar221,0xff);
    fVar236 = auVar181._12_4_;
    auVar111._0_4_ =
         fVar304 * (fVar349 * auVar326._0_4_ + fVar304 * auVar216._0_4_) + auVar326._0_4_ * fVar239;
    auVar111._4_4_ =
         fVar312 * (fVar350 * auVar326._4_4_ + fVar312 * auVar216._4_4_) + auVar326._4_4_ * fVar116;
    auVar111._8_4_ =
         fVar313 * (fVar367 * auVar326._8_4_ + fVar313 * auVar216._8_4_) + auVar326._8_4_ * fVar117;
    auVar111._12_4_ =
         fVar314 * (auVar167._12_4_ * auVar326._12_4_ + fVar314 * fVar206) +
         auVar326._12_4_ * fVar118;
    auVar111._16_4_ =
         fVar315 * (fVar349 * auVar326._16_4_ + fVar315 * auVar216._0_4_) +
         auVar326._16_4_ * fVar119;
    auVar111._20_4_ =
         fVar316 * (fVar350 * auVar326._20_4_ + fVar316 * auVar216._4_4_) +
         auVar326._20_4_ * fVar208;
    auVar111._24_4_ =
         fVar317 * (fVar367 * auVar326._24_4_ + fVar317 * auVar216._8_4_) +
         auVar326._24_4_ * fVar255;
    auVar111._28_4_ = auVar21._28_4_ + fVar206 + fVar236;
    auVar147._0_4_ =
         fVar304 * (fVar282 * auVar326._0_4_ + auVar132._0_4_ * fVar304) + auVar326._0_4_ * fVar283;
    auVar147._4_4_ =
         fVar312 * (fVar299 * auVar326._4_4_ + auVar132._4_4_ * fVar312) + auVar326._4_4_ * fVar300;
    auVar147._8_4_ =
         fVar313 * (fVar338 * auVar326._8_4_ + auVar132._8_4_ * fVar313) + auVar326._8_4_ * fVar301;
    auVar147._12_4_ =
         fVar314 * (fVar345 * auVar326._12_4_ + auVar132._12_4_ * fVar314) +
         auVar326._12_4_ * fVar302;
    auVar147._16_4_ =
         fVar315 * (fVar282 * auVar326._16_4_ + auVar132._0_4_ * fVar315) +
         auVar326._16_4_ * fVar346;
    auVar147._20_4_ =
         fVar316 * (fVar299 * auVar326._20_4_ + auVar132._4_4_ * fVar316) +
         auVar326._20_4_ * fVar303;
    auVar147._24_4_ =
         fVar317 * (fVar338 * auVar326._24_4_ + auVar132._8_4_ * fVar317) +
         auVar326._24_4_ * fVar347;
    auVar147._28_4_ = fVar206 + auVar20._28_4_ + fVar236;
    auVar20 = vperm2f128_avx(local_220,local_220,1);
    auVar20 = vshufps_avx(auVar20,local_220,0x30);
    auVar109 = vshufps_avx(local_220,auVar20,0x29);
    auVar254._0_4_ =
         auVar326._0_4_ * (auVar96._0_4_ * auVar326._0_4_ + fVar304 * fVar279) + fVar304 * fVar239;
    auVar254._4_4_ =
         auVar326._4_4_ * (auVar96._4_4_ * auVar326._4_4_ + fVar312 * fVar281) + fVar312 * fVar116;
    auVar254._8_4_ =
         auVar326._8_4_ * (auVar96._8_4_ * auVar326._8_4_ + fVar313 * fVar202) + fVar313 * fVar117;
    auVar254._12_4_ =
         auVar326._12_4_ * (auVar96._12_4_ * auVar326._12_4_ + fVar314 * fVar209) +
         fVar314 * fVar118;
    auVar254._16_4_ =
         auVar326._16_4_ * (auVar96._0_4_ * auVar326._16_4_ + fVar315 * fVar279) + fVar315 * fVar119
    ;
    auVar254._20_4_ =
         auVar326._20_4_ * (auVar96._4_4_ * auVar326._20_4_ + fVar316 * fVar281) + fVar316 * fVar208
    ;
    auVar254._24_4_ =
         auVar326._24_4_ * (auVar96._8_4_ * auVar326._24_4_ + fVar317 * fVar202) + fVar317 * fVar255
    ;
    auVar254._28_4_ = fVar348 + fVar356 + auVar253._28_4_;
    auVar298._0_4_ =
         fVar304 * fVar283 + auVar326._0_4_ * (auVar326._0_4_ * auVar181._0_4_ + fVar304 * fVar280);
    auVar298._4_4_ =
         fVar312 * fVar300 + auVar326._4_4_ * (auVar326._4_4_ * auVar181._4_4_ + fVar312 * fVar185);
    auVar298._8_4_ =
         fVar313 * fVar301 + auVar326._8_4_ * (auVar326._8_4_ * auVar181._8_4_ + fVar313 * fVar204);
    auVar298._12_4_ =
         fVar314 * fVar302 + auVar326._12_4_ * (auVar326._12_4_ * fVar236 + fVar314 * fVar234);
    auVar298._16_4_ =
         fVar315 * fVar346 +
         auVar326._16_4_ * (auVar326._16_4_ * auVar181._0_4_ + fVar315 * fVar280);
    auVar298._20_4_ =
         fVar316 * fVar303 +
         auVar326._20_4_ * (auVar326._20_4_ * auVar181._4_4_ + fVar316 * fVar185);
    auVar298._24_4_ =
         fVar317 * fVar347 +
         auVar326._24_4_ * (auVar326._24_4_ * auVar181._8_4_ + fVar317 * fVar204);
    auVar298._28_4_ = fVar356 + fVar345 + fVar236 + fVar234;
    auVar278._0_4_ = fVar304 * auVar111._0_4_ + auVar326._0_4_ * auVar254._0_4_;
    auVar278._4_4_ = fVar312 * auVar111._4_4_ + auVar326._4_4_ * auVar254._4_4_;
    auVar278._8_4_ = fVar313 * auVar111._8_4_ + auVar326._8_4_ * auVar254._8_4_;
    auVar278._12_4_ = fVar314 * auVar111._12_4_ + auVar326._12_4_ * auVar254._12_4_;
    auVar278._16_4_ = fVar315 * auVar111._16_4_ + auVar326._16_4_ * auVar254._16_4_;
    auVar278._20_4_ = fVar316 * auVar111._20_4_ + auVar326._20_4_ * auVar254._20_4_;
    auVar278._24_4_ = fVar317 * auVar111._24_4_ + auVar326._24_4_ * auVar254._24_4_;
    auVar278._28_4_ = fVar348 + fVar236 + fVar234;
    auVar311._0_4_ = fVar304 * auVar147._0_4_ + auVar326._0_4_ * auVar298._0_4_;
    auVar311._4_4_ = fVar312 * auVar147._4_4_ + auVar326._4_4_ * auVar298._4_4_;
    auVar311._8_4_ = fVar313 * auVar147._8_4_ + auVar326._8_4_ * auVar298._8_4_;
    auVar311._12_4_ = fVar314 * auVar147._12_4_ + auVar326._12_4_ * auVar298._12_4_;
    auVar311._16_4_ = fVar315 * auVar147._16_4_ + auVar326._16_4_ * auVar298._16_4_;
    auVar311._20_4_ = fVar316 * auVar147._20_4_ + auVar326._20_4_ * auVar298._20_4_;
    auVar311._24_4_ = fVar317 * auVar147._24_4_ + auVar326._24_4_ * auVar298._24_4_;
    auVar311._28_4_ = auVar18._28_4_ + auVar326._28_4_;
    auVar22 = vsubps_avx(auVar254,auVar111);
    auVar20 = vsubps_avx(auVar298,auVar147);
    local_2a0 = local_620 * auVar22._0_4_ * 3.0;
    fStack_29c = fStack_61c * auVar22._4_4_ * 3.0;
    auVar18._4_4_ = fStack_29c;
    auVar18._0_4_ = local_2a0;
    fStack_298 = fStack_618 * auVar22._8_4_ * 3.0;
    auVar18._8_4_ = fStack_298;
    fStack_294 = fStack_614 * auVar22._12_4_ * 3.0;
    auVar18._12_4_ = fStack_294;
    fStack_290 = local_620 * auVar22._16_4_ * 3.0;
    auVar18._16_4_ = fStack_290;
    fStack_28c = fStack_61c * auVar22._20_4_ * 3.0;
    auVar18._20_4_ = fStack_28c;
    fStack_288 = fStack_618 * auVar22._24_4_ * 3.0;
    auVar18._24_4_ = fStack_288;
    auVar18._28_4_ = auVar22._28_4_;
    local_2c0 = local_620 * auVar20._0_4_ * 3.0;
    fStack_2bc = fStack_61c * auVar20._4_4_ * 3.0;
    auVar23._4_4_ = fStack_2bc;
    auVar23._0_4_ = local_2c0;
    fStack_2b8 = fStack_618 * auVar20._8_4_ * 3.0;
    auVar23._8_4_ = fStack_2b8;
    fStack_2b4 = fStack_614 * auVar20._12_4_ * 3.0;
    auVar23._12_4_ = fStack_2b4;
    fStack_2b0 = local_620 * auVar20._16_4_ * 3.0;
    auVar23._16_4_ = fStack_2b0;
    fStack_2ac = fStack_61c * auVar20._20_4_ * 3.0;
    auVar23._20_4_ = fStack_2ac;
    fStack_2a8 = fStack_618 * auVar20._24_4_ * 3.0;
    auVar23._24_4_ = fStack_2a8;
    auVar23._28_4_ = auVar254._28_4_;
    auVar20 = vperm2f128_avx(auVar278,auVar278,1);
    auVar20 = vshufps_avx(auVar20,auVar278,0x30);
    auVar110 = vshufps_avx(auVar278,auVar20,0x29);
    auVar18 = vsubps_avx(auVar278,auVar18);
    auVar20 = vperm2f128_avx(auVar18,auVar18,1);
    auVar20 = vshufps_avx(auVar20,auVar18,0x30);
    auVar20 = vshufps_avx(auVar18,auVar20,0x29);
    auVar23 = vsubps_avx(auVar311,auVar23);
    auVar18 = vperm2f128_avx(auVar23,auVar23,1);
    auVar18 = vshufps_avx(auVar18,auVar23,0x30);
    local_200 = vshufps_avx(auVar23,auVar18,0x29);
    auVar24 = vsubps_avx(auVar278,local_220);
    auVar111 = vsubps_avx(auVar110,auVar109);
    fVar279 = auVar111._0_4_ + auVar24._0_4_;
    fVar280 = auVar111._4_4_ + auVar24._4_4_;
    fVar281 = auVar111._8_4_ + auVar24._8_4_;
    fVar185 = auVar111._12_4_ + auVar24._12_4_;
    fVar202 = auVar111._16_4_ + auVar24._16_4_;
    fVar204 = auVar111._20_4_ + auVar24._20_4_;
    fVar206 = auVar111._24_4_ + auVar24._24_4_;
    auVar18 = vperm2f128_avx(auVar201,auVar201,1);
    auVar18 = vshufps_avx(auVar18,auVar201,0x30);
    local_240 = vshufps_avx(auVar201,auVar18,0x29);
    auVar18 = vperm2f128_avx(auVar311,auVar311,1);
    auVar18 = vshufps_avx(auVar18,auVar311,0x30);
    auVar23 = vshufps_avx(auVar311,auVar18,0x29);
    auVar18 = vsubps_avx(auVar311,auVar201);
    auVar147 = vsubps_avx(auVar23,local_240);
    fVar209 = auVar147._0_4_ + auVar18._0_4_;
    fVar234 = auVar147._4_4_ + auVar18._4_4_;
    fVar236 = auVar147._8_4_ + auVar18._8_4_;
    fVar239 = auVar147._12_4_ + auVar18._12_4_;
    fVar116 = auVar147._16_4_ + auVar18._16_4_;
    fVar117 = auVar147._20_4_ + auVar18._20_4_;
    fVar118 = auVar147._24_4_ + auVar18._24_4_;
    auVar25._4_4_ = fVar280 * auVar201._4_4_;
    auVar25._0_4_ = fVar279 * auVar201._0_4_;
    auVar25._8_4_ = fVar281 * auVar201._8_4_;
    auVar25._12_4_ = fVar185 * auVar201._12_4_;
    auVar25._16_4_ = fVar202 * auVar201._16_4_;
    auVar25._20_4_ = fVar204 * auVar201._20_4_;
    auVar25._24_4_ = fVar206 * auVar201._24_4_;
    auVar25._28_4_ = auVar18._28_4_;
    auVar26._4_4_ = fVar234 * local_220._4_4_;
    auVar26._0_4_ = fVar209 * local_220._0_4_;
    auVar26._8_4_ = fVar236 * local_220._8_4_;
    auVar26._12_4_ = fVar239 * local_220._12_4_;
    auVar26._16_4_ = fVar116 * local_220._16_4_;
    auVar26._20_4_ = fVar117 * local_220._20_4_;
    auVar26._24_4_ = fVar118 * local_220._24_4_;
    auVar26._28_4_ = fVar348;
    auVar25 = vsubps_avx(auVar25,auVar26);
    local_260 = local_220._0_4_ + local_260;
    fStack_25c = local_220._4_4_ + fStack_25c;
    fStack_258 = local_220._8_4_ + fStack_258;
    fStack_254 = local_220._12_4_ + fStack_254;
    fStack_250 = local_220._16_4_ + fStack_250;
    fStack_24c = local_220._20_4_ + fStack_24c;
    fStack_248 = local_220._24_4_ + fStack_248;
    fStack_244 = local_220._28_4_ + auVar19._28_4_;
    local_280 = local_280 + auVar201._0_4_;
    fStack_27c = fStack_27c + auVar201._4_4_;
    fStack_278 = fStack_278 + auVar201._8_4_;
    fStack_274 = fStack_274 + auVar201._12_4_;
    fStack_270 = fStack_270 + auVar201._16_4_;
    fStack_26c = fStack_26c + auVar201._20_4_;
    fStack_268 = fStack_268 + auVar201._24_4_;
    fStack_264 = fVar351 + auVar201._28_4_;
    auVar19._4_4_ = fVar280 * fStack_27c;
    auVar19._0_4_ = fVar279 * local_280;
    auVar19._8_4_ = fVar281 * fStack_278;
    auVar19._12_4_ = fVar185 * fStack_274;
    auVar19._16_4_ = fVar202 * fStack_270;
    auVar19._20_4_ = fVar204 * fStack_26c;
    auVar19._24_4_ = fVar206 * fStack_268;
    auVar19._28_4_ = fVar351;
    auVar27._4_4_ = fVar234 * fStack_25c;
    auVar27._0_4_ = fVar209 * local_260;
    auVar27._8_4_ = fVar236 * fStack_258;
    auVar27._12_4_ = fVar239 * fStack_254;
    auVar27._16_4_ = fVar116 * fStack_250;
    auVar27._20_4_ = fVar117 * fStack_24c;
    auVar27._24_4_ = fVar118 * fStack_248;
    auVar27._28_4_ = fVar351 + auVar201._28_4_;
    auVar19 = vsubps_avx(auVar19,auVar27);
    local_680 = auVar21._0_4_;
    fStack_67c = auVar21._4_4_;
    fStack_678 = auVar21._8_4_;
    fStack_674 = auVar21._12_4_;
    fStack_670 = auVar21._16_4_;
    fStack_66c = auVar21._20_4_;
    fStack_668 = auVar21._24_4_;
    auVar28._4_4_ = fVar280 * fStack_67c;
    auVar28._0_4_ = fVar279 * local_680;
    auVar28._8_4_ = fVar281 * fStack_678;
    auVar28._12_4_ = fVar185 * fStack_674;
    auVar28._16_4_ = fVar202 * fStack_670;
    auVar28._20_4_ = fVar204 * fStack_66c;
    auVar28._24_4_ = fVar206 * fStack_668;
    auVar28._28_4_ = fVar351;
    local_700._0_4_ = auVar108._0_4_;
    local_700._4_4_ = auVar108._4_4_;
    fStack_6f8 = auVar108._8_4_;
    fStack_6f4 = auVar108._12_4_;
    fStack_6f0 = auVar108._16_4_;
    fStack_6ec = auVar108._20_4_;
    fStack_6e8 = auVar108._24_4_;
    auVar29._4_4_ = fVar234 * (float)local_700._4_4_;
    auVar29._0_4_ = fVar209 * (float)local_700._0_4_;
    auVar29._8_4_ = fVar236 * fStack_6f8;
    auVar29._12_4_ = fVar239 * fStack_6f4;
    auVar29._16_4_ = fVar116 * fStack_6f0;
    auVar29._20_4_ = fVar117 * fStack_6ec;
    auVar29._24_4_ = fVar118 * fStack_6e8;
    auVar29._28_4_ = local_220._28_4_;
    auVar26 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = local_240._4_4_ * fVar280;
    auVar30._0_4_ = local_240._0_4_ * fVar279;
    auVar30._8_4_ = local_240._8_4_ * fVar281;
    auVar30._12_4_ = local_240._12_4_ * fVar185;
    auVar30._16_4_ = local_240._16_4_ * fVar202;
    auVar30._20_4_ = local_240._20_4_ * fVar204;
    auVar30._24_4_ = local_240._24_4_ * fVar206;
    auVar30._28_4_ = fVar351;
    auVar31._4_4_ = auVar109._4_4_ * fVar234;
    auVar31._0_4_ = auVar109._0_4_ * fVar209;
    auVar31._8_4_ = auVar109._8_4_ * fVar236;
    auVar31._12_4_ = auVar109._12_4_ * fVar239;
    auVar31._16_4_ = auVar109._16_4_ * fVar116;
    auVar31._20_4_ = auVar109._20_4_ * fVar117;
    auVar31._24_4_ = auVar109._24_4_ * fVar118;
    auVar31._28_4_ = local_240._28_4_;
    local_620 = auVar20._0_4_;
    fStack_61c = auVar20._4_4_;
    fStack_618 = auVar20._8_4_;
    fStack_614 = auVar20._12_4_;
    fStack_610 = auVar20._16_4_;
    fStack_60c = auVar20._20_4_;
    fStack_608 = auVar20._24_4_;
    auVar27 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = auVar311._4_4_ * fVar280;
    auVar32._0_4_ = auVar311._0_4_ * fVar279;
    auVar32._8_4_ = auVar311._8_4_ * fVar281;
    auVar32._12_4_ = auVar311._12_4_ * fVar185;
    auVar32._16_4_ = auVar311._16_4_ * fVar202;
    auVar32._20_4_ = auVar311._20_4_ * fVar204;
    auVar32._24_4_ = auVar311._24_4_ * fVar206;
    auVar32._28_4_ = fVar351;
    auVar33._4_4_ = fVar234 * auVar278._4_4_;
    auVar33._0_4_ = fVar209 * auVar278._0_4_;
    auVar33._8_4_ = fVar236 * auVar278._8_4_;
    auVar33._12_4_ = fVar239 * auVar278._12_4_;
    auVar33._16_4_ = fVar116 * auVar278._16_4_;
    auVar33._20_4_ = fVar117 * auVar278._20_4_;
    auVar33._24_4_ = fVar118 * auVar278._24_4_;
    auVar33._28_4_ = fStack_244;
    auVar28 = vsubps_avx(auVar32,auVar33);
    local_2a0 = auVar278._0_4_ + local_2a0;
    fStack_29c = auVar278._4_4_ + fStack_29c;
    fStack_298 = auVar278._8_4_ + fStack_298;
    fStack_294 = auVar278._12_4_ + fStack_294;
    fStack_290 = auVar278._16_4_ + fStack_290;
    fStack_28c = auVar278._20_4_ + fStack_28c;
    fStack_288 = auVar278._24_4_ + fStack_288;
    fStack_284 = auVar278._28_4_ + auVar22._28_4_;
    local_2c0 = auVar311._0_4_ + local_2c0;
    fStack_2bc = auVar311._4_4_ + fStack_2bc;
    fStack_2b8 = auVar311._8_4_ + fStack_2b8;
    fStack_2b4 = auVar311._12_4_ + fStack_2b4;
    fStack_2b0 = auVar311._16_4_ + fStack_2b0;
    fStack_2ac = auVar311._20_4_ + fStack_2ac;
    fStack_2a8 = auVar311._24_4_ + fStack_2a8;
    fStack_2a4 = auVar311._28_4_ + auVar254._28_4_;
    auVar22._4_4_ = fVar280 * fStack_2bc;
    auVar22._0_4_ = fVar279 * local_2c0;
    auVar22._8_4_ = fVar281 * fStack_2b8;
    auVar22._12_4_ = fVar185 * fStack_2b4;
    auVar22._16_4_ = fVar202 * fStack_2b0;
    auVar22._20_4_ = fVar204 * fStack_2ac;
    auVar22._24_4_ = fVar206 * fStack_2a8;
    auVar22._28_4_ = auVar311._28_4_ + auVar254._28_4_;
    auVar34._4_4_ = fStack_29c * fVar234;
    auVar34._0_4_ = local_2a0 * fVar209;
    auVar34._8_4_ = fStack_298 * fVar236;
    auVar34._12_4_ = fStack_294 * fVar239;
    auVar34._16_4_ = fStack_290 * fVar116;
    auVar34._20_4_ = fStack_28c * fVar117;
    auVar34._24_4_ = fStack_288 * fVar118;
    auVar34._28_4_ = fStack_284;
    auVar22 = vsubps_avx(auVar22,auVar34);
    auVar35._4_4_ = fVar280 * local_200._4_4_;
    auVar35._0_4_ = fVar279 * local_200._0_4_;
    auVar35._8_4_ = fVar281 * local_200._8_4_;
    auVar35._12_4_ = fVar185 * local_200._12_4_;
    auVar35._16_4_ = fVar202 * local_200._16_4_;
    auVar35._20_4_ = fVar204 * local_200._20_4_;
    auVar35._24_4_ = fVar206 * local_200._24_4_;
    auVar35._28_4_ = fStack_284;
    auVar36._4_4_ = fVar234 * fStack_61c;
    auVar36._0_4_ = fVar209 * local_620;
    auVar36._8_4_ = fVar236 * fStack_618;
    auVar36._12_4_ = fVar239 * fStack_614;
    auVar36._16_4_ = fVar116 * fStack_610;
    auVar36._20_4_ = fVar117 * fStack_60c;
    auVar36._24_4_ = fVar118 * fStack_608;
    auVar36._28_4_ = local_200._28_4_;
    auVar29 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = fVar280 * auVar23._4_4_;
    auVar37._0_4_ = fVar279 * auVar23._0_4_;
    auVar37._8_4_ = fVar281 * auVar23._8_4_;
    auVar37._12_4_ = fVar185 * auVar23._12_4_;
    auVar37._16_4_ = fVar202 * auVar23._16_4_;
    auVar37._20_4_ = fVar204 * auVar23._20_4_;
    auVar37._24_4_ = fVar206 * auVar23._24_4_;
    auVar37._28_4_ = auVar111._28_4_ + auVar24._28_4_;
    auVar24._4_4_ = auVar110._4_4_ * fVar234;
    auVar24._0_4_ = auVar110._0_4_ * fVar209;
    auVar24._8_4_ = auVar110._8_4_ * fVar236;
    auVar24._12_4_ = auVar110._12_4_ * fVar239;
    auVar24._16_4_ = auVar110._16_4_ * fVar116;
    auVar24._20_4_ = auVar110._20_4_ * fVar117;
    auVar24._24_4_ = auVar110._24_4_ * fVar118;
    auVar24._28_4_ = auVar147._28_4_ + auVar18._28_4_;
    auVar24 = vsubps_avx(auVar37,auVar24);
    auVar20 = vminps_avx(auVar25,auVar19);
    auVar108 = vmaxps_avx(auVar25,auVar19);
    auVar21 = vminps_avx(auVar26,auVar27);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar26,auVar27);
    auVar108 = vmaxps_avx(auVar108,auVar20);
    auVar18 = vminps_avx(auVar28,auVar22);
    auVar20 = vmaxps_avx(auVar28,auVar22);
    auVar19 = vminps_avx(auVar29,auVar24);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar19 = vminps_avx(auVar21,auVar19);
    auVar21 = vmaxps_avx(auVar29,auVar24);
    auVar20 = vmaxps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar108,auVar20);
    auVar108 = vcmpps_avx(auVar19,local_1c0,2);
    auVar20 = vcmpps_avx(auVar20,local_1e0,5);
    auVar108 = vandps_avx(auVar20,auVar108);
    auVar20 = local_2e0 & auVar108;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0x7f,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0xbf,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0')
    {
      auVar20 = vsubps_avx(auVar109,local_220);
      auVar21 = vsubps_avx(auVar110,auVar278);
      fVar280 = auVar20._0_4_ + auVar21._0_4_;
      fVar281 = auVar20._4_4_ + auVar21._4_4_;
      fVar185 = auVar20._8_4_ + auVar21._8_4_;
      fVar202 = auVar20._12_4_ + auVar21._12_4_;
      fVar204 = auVar20._16_4_ + auVar21._16_4_;
      fVar206 = auVar20._20_4_ + auVar21._20_4_;
      fVar209 = auVar20._24_4_ + auVar21._24_4_;
      auVar19 = vsubps_avx(local_240,auVar201);
      auVar22 = vsubps_avx(auVar23,auVar311);
      fVar234 = auVar19._0_4_ + auVar22._0_4_;
      fVar236 = auVar19._4_4_ + auVar22._4_4_;
      fVar239 = auVar19._8_4_ + auVar22._8_4_;
      fVar116 = auVar19._12_4_ + auVar22._12_4_;
      fVar117 = auVar19._16_4_ + auVar22._16_4_;
      fVar118 = auVar19._20_4_ + auVar22._20_4_;
      fVar119 = auVar19._24_4_ + auVar22._24_4_;
      fVar279 = auVar22._28_4_;
      auVar38._4_4_ = auVar201._4_4_ * fVar281;
      auVar38._0_4_ = auVar201._0_4_ * fVar280;
      auVar38._8_4_ = auVar201._8_4_ * fVar185;
      auVar38._12_4_ = auVar201._12_4_ * fVar202;
      auVar38._16_4_ = auVar201._16_4_ * fVar204;
      auVar38._20_4_ = auVar201._20_4_ * fVar206;
      auVar38._24_4_ = auVar201._24_4_ * fVar209;
      auVar38._28_4_ = auVar201._28_4_;
      auVar39._4_4_ = local_220._4_4_ * fVar236;
      auVar39._0_4_ = local_220._0_4_ * fVar234;
      auVar39._8_4_ = local_220._8_4_ * fVar239;
      auVar39._12_4_ = local_220._12_4_ * fVar116;
      auVar39._16_4_ = local_220._16_4_ * fVar117;
      auVar39._20_4_ = local_220._20_4_ * fVar118;
      auVar39._24_4_ = local_220._24_4_ * fVar119;
      auVar39._28_4_ = local_220._28_4_;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar281 * fStack_27c;
      auVar40._0_4_ = fVar280 * local_280;
      auVar40._8_4_ = fVar185 * fStack_278;
      auVar40._12_4_ = fVar202 * fStack_274;
      auVar40._16_4_ = fVar204 * fStack_270;
      auVar40._20_4_ = fVar206 * fStack_26c;
      auVar40._24_4_ = fVar209 * fStack_268;
      auVar40._28_4_ = auVar201._28_4_;
      auVar41._4_4_ = fVar236 * fStack_25c;
      auVar41._0_4_ = fVar234 * local_260;
      auVar41._8_4_ = fVar239 * fStack_258;
      auVar41._12_4_ = fVar116 * fStack_254;
      auVar41._16_4_ = fVar117 * fStack_250;
      auVar41._20_4_ = fVar118 * fStack_24c;
      auVar41._24_4_ = fVar119 * fStack_248;
      auVar41._28_4_ = fVar279;
      auVar24 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = fVar281 * fStack_67c;
      auVar42._0_4_ = fVar280 * local_680;
      auVar42._8_4_ = fVar185 * fStack_678;
      auVar42._12_4_ = fVar202 * fStack_674;
      auVar42._16_4_ = fVar204 * fStack_670;
      auVar42._20_4_ = fVar206 * fStack_66c;
      auVar42._24_4_ = fVar209 * fStack_668;
      auVar42._28_4_ = fVar279;
      auVar43._4_4_ = fVar236 * (float)local_700._4_4_;
      auVar43._0_4_ = fVar234 * (float)local_700._0_4_;
      auVar43._8_4_ = fVar239 * fStack_6f8;
      auVar43._12_4_ = fVar116 * fStack_6f4;
      auVar43._16_4_ = fVar117 * fStack_6f0;
      auVar43._20_4_ = fVar118 * fStack_6ec;
      auVar43._24_4_ = fVar119 * fStack_6e8;
      auVar43._28_4_ = auVar18._28_4_;
      auVar111 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = local_240._4_4_ * fVar281;
      auVar44._0_4_ = local_240._0_4_ * fVar280;
      auVar44._8_4_ = local_240._8_4_ * fVar185;
      auVar44._12_4_ = local_240._12_4_ * fVar202;
      auVar44._16_4_ = local_240._16_4_ * fVar204;
      auVar44._20_4_ = local_240._20_4_ * fVar206;
      auVar44._24_4_ = local_240._24_4_ * fVar209;
      auVar44._28_4_ = auVar18._28_4_;
      auVar45._4_4_ = auVar109._4_4_ * fVar236;
      auVar45._0_4_ = auVar109._0_4_ * fVar234;
      auVar45._8_4_ = auVar109._8_4_ * fVar239;
      auVar45._12_4_ = auVar109._12_4_ * fVar116;
      auVar45._16_4_ = auVar109._16_4_ * fVar117;
      auVar45._20_4_ = auVar109._20_4_ * fVar118;
      uVar74 = auVar109._28_4_;
      auVar45._24_4_ = auVar109._24_4_ * fVar119;
      auVar45._28_4_ = uVar74;
      auVar109 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = auVar311._4_4_ * fVar281;
      auVar46._0_4_ = auVar311._0_4_ * fVar280;
      auVar46._8_4_ = auVar311._8_4_ * fVar185;
      auVar46._12_4_ = auVar311._12_4_ * fVar202;
      auVar46._16_4_ = auVar311._16_4_ * fVar204;
      auVar46._20_4_ = auVar311._20_4_ * fVar206;
      auVar46._24_4_ = auVar311._24_4_ * fVar209;
      auVar46._28_4_ = uVar74;
      auVar47._4_4_ = auVar278._4_4_ * fVar236;
      auVar47._0_4_ = auVar278._0_4_ * fVar234;
      auVar47._8_4_ = auVar278._8_4_ * fVar239;
      auVar47._12_4_ = auVar278._12_4_ * fVar116;
      auVar47._16_4_ = auVar278._16_4_ * fVar117;
      auVar47._20_4_ = auVar278._20_4_ * fVar118;
      auVar47._24_4_ = auVar278._24_4_ * fVar119;
      auVar47._28_4_ = auVar278._28_4_;
      auVar147 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar281 * fStack_2bc;
      auVar48._0_4_ = fVar280 * local_2c0;
      auVar48._8_4_ = fVar185 * fStack_2b8;
      auVar48._12_4_ = fVar202 * fStack_2b4;
      auVar48._16_4_ = fVar204 * fStack_2b0;
      auVar48._20_4_ = fVar206 * fStack_2ac;
      auVar48._24_4_ = fVar209 * fStack_2a8;
      auVar48._28_4_ = uVar74;
      auVar49._4_4_ = fVar236 * fStack_29c;
      auVar49._0_4_ = fVar234 * local_2a0;
      auVar49._8_4_ = fVar239 * fStack_298;
      auVar49._12_4_ = fVar116 * fStack_294;
      auVar49._16_4_ = fVar117 * fStack_290;
      auVar49._20_4_ = fVar118 * fStack_28c;
      auVar49._24_4_ = fVar119 * fStack_288;
      auVar49._28_4_ = auVar311._28_4_;
      auVar25 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fVar281 * local_200._4_4_;
      auVar50._0_4_ = fVar280 * local_200._0_4_;
      auVar50._8_4_ = fVar185 * local_200._8_4_;
      auVar50._12_4_ = fVar202 * local_200._12_4_;
      auVar50._16_4_ = fVar204 * local_200._16_4_;
      auVar50._20_4_ = fVar206 * local_200._20_4_;
      auVar50._24_4_ = fVar209 * local_200._24_4_;
      auVar50._28_4_ = auVar311._28_4_;
      auVar51._4_4_ = fStack_61c * fVar236;
      auVar51._0_4_ = local_620 * fVar234;
      auVar51._8_4_ = fStack_618 * fVar239;
      auVar51._12_4_ = fStack_614 * fVar116;
      auVar51._16_4_ = fStack_610 * fVar117;
      auVar51._20_4_ = fStack_60c * fVar118;
      auVar51._24_4_ = fStack_608 * fVar119;
      auVar51._28_4_ = local_240._28_4_;
      auVar26 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = fVar281 * auVar23._4_4_;
      auVar52._0_4_ = fVar280 * auVar23._0_4_;
      auVar52._8_4_ = fVar185 * auVar23._8_4_;
      auVar52._12_4_ = fVar202 * auVar23._12_4_;
      auVar52._16_4_ = fVar204 * auVar23._16_4_;
      auVar52._20_4_ = fVar206 * auVar23._20_4_;
      auVar52._24_4_ = fVar209 * auVar23._24_4_;
      auVar52._28_4_ = auVar20._28_4_ + auVar21._28_4_;
      auVar53._4_4_ = auVar110._4_4_ * fVar236;
      auVar53._0_4_ = auVar110._0_4_ * fVar234;
      auVar53._8_4_ = auVar110._8_4_ * fVar239;
      auVar53._12_4_ = auVar110._12_4_ * fVar116;
      auVar53._16_4_ = auVar110._16_4_ * fVar117;
      auVar53._20_4_ = auVar110._20_4_ * fVar118;
      auVar53._24_4_ = auVar110._24_4_ * fVar119;
      auVar53._28_4_ = auVar19._28_4_ + fVar279;
      auVar110 = vsubps_avx(auVar52,auVar53);
      auVar21 = vminps_avx(auVar22,auVar24);
      auVar20 = vmaxps_avx(auVar22,auVar24);
      auVar18 = vminps_avx(auVar111,auVar109);
      auVar18 = vminps_avx(auVar21,auVar18);
      auVar21 = vmaxps_avx(auVar111,auVar109);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar19 = vminps_avx(auVar147,auVar25);
      auVar21 = vmaxps_avx(auVar147,auVar25);
      auVar109 = vminps_avx(auVar26,auVar110);
      auVar19 = vminps_avx(auVar19,auVar109);
      auVar19 = vminps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar26,auVar110);
      auVar21 = vmaxps_avx(auVar21,auVar18);
      auVar21 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vcmpps_avx(auVar19,local_1c0,2);
      auVar21 = vcmpps_avx(auVar21,local_1e0,5);
      auVar20 = vandps_avx(auVar21,auVar20);
      auVar108 = vandps_avx(local_2e0,auVar108);
      auVar21 = auVar108 & auVar20;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar108 = vandps_avx(auVar20,auVar108);
        uVar64 = vmovmskps_avx(auVar108);
        if (uVar64 != 0) {
          auStack_490[uVar67] = uVar64 & 0xff;
          uVar5 = vmovlps_avx(local_420);
          *(undefined8 *)(afStack_340 + uVar67 * 2) = uVar5;
          uVar6 = vmovlps_avx(auVar79);
          auStack_1a0[uVar67] = uVar6;
          uVar67 = (ulong)((int)uVar67 + 1);
        }
      }
    }
LAB_008edd63:
    do {
      do {
        do {
          do {
            if ((int)uVar67 == 0) {
              uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar107._4_4_ = uVar74;
              auVar107._0_4_ = uVar74;
              auVar107._8_4_ = uVar74;
              auVar107._12_4_ = uVar74;
              auVar96 = vcmpps_avx(local_480,auVar107,2);
              uVar65 = vmovmskps_avx(auVar96);
              uVar66 = (ulong)((uint)uVar66 & (uint)uVar66 + 0xf & uVar65);
              auVar55 = ZEXT812(0) << 0x20;
              goto LAB_008eca21;
            }
            uVar68 = (int)uVar67 - 1;
            uVar70 = (ulong)uVar68;
            uVar64 = auStack_490[uVar70];
            fVar279 = afStack_340[uVar70 * 2];
            fVar280 = afStack_340[uVar70 * 2 + 1];
            auVar331._8_8_ = 0;
            auVar331._0_8_ = auStack_1a0[uVar70];
            auVar337 = ZEXT1664(auVar331);
            uVar6 = 0;
            if (uVar64 != 0) {
              for (; (uVar64 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            uVar64 = uVar64 - 1 & uVar64;
            auStack_490[uVar70] = uVar64;
            if (uVar64 == 0) {
              uVar67 = (ulong)uVar68;
            }
            fVar185 = (float)(uVar6 + 1) * 0.14285715;
            fVar281 = (1.0 - (float)uVar6 * 0.14285715) * fVar279 +
                      fVar280 * (float)uVar6 * 0.14285715;
            fVar279 = (1.0 - fVar185) * fVar279 + fVar280 * fVar185;
            fVar280 = fVar279 - fVar281;
            if (0.16666667 <= fVar280) {
              auVar96 = vinsertps_avx(ZEXT416((uint)fVar281),ZEXT416((uint)fVar279),0x10);
              auVar366 = ZEXT1664(auVar96);
              goto LAB_008ed6f4;
            }
            auVar96 = vshufps_avx(auVar331,auVar331,0x50);
            auVar130._8_4_ = 0x3f800000;
            auVar130._0_8_ = 0x3f8000003f800000;
            auVar130._12_4_ = 0x3f800000;
            auVar216 = vsubps_avx(auVar130,auVar96);
            fVar185 = auVar96._0_4_;
            fVar202 = auVar96._4_4_;
            fVar204 = auVar96._8_4_;
            fVar206 = auVar96._12_4_;
            fVar209 = auVar216._0_4_;
            fVar234 = auVar216._4_4_;
            fVar236 = auVar216._8_4_;
            fVar239 = auVar216._12_4_;
            auVar165._0_4_ = fVar185 * auVar294._0_4_ + fVar209 * auVar359._0_4_;
            auVar165._4_4_ = fVar202 * auVar294._4_4_ + fVar234 * auVar359._4_4_;
            auVar165._8_4_ = fVar204 * auVar294._0_4_ + fVar236 * auVar359._0_4_;
            auVar165._12_4_ = fVar206 * auVar294._4_4_ + fVar239 * auVar359._4_4_;
            auVar222._0_4_ = auVar306._0_4_ * fVar185 + auVar354._0_4_ * fVar209;
            auVar222._4_4_ = auVar306._4_4_ * fVar202 + auVar354._4_4_ * fVar234;
            auVar222._8_4_ = auVar306._0_4_ * fVar204 + auVar354._0_4_ * fVar236;
            auVar222._12_4_ = auVar306._4_4_ * fVar206 + auVar354._4_4_ * fVar239;
            auVar247._0_4_ = auVar322._0_4_ * fVar185 + auVar196._0_4_ * fVar209;
            auVar247._4_4_ = auVar322._4_4_ * fVar202 + auVar196._4_4_ * fVar234;
            auVar247._8_4_ = auVar322._0_4_ * fVar204 + auVar196._0_4_ * fVar236;
            auVar247._12_4_ = auVar322._4_4_ * fVar206 + auVar196._4_4_ * fVar239;
            auVar93._0_4_ = auVar91._0_4_ * fVar185 + auVar129._0_4_ * fVar209;
            auVar93._4_4_ = auVar91._4_4_ * fVar202 + auVar129._4_4_ * fVar234;
            auVar93._8_4_ = auVar91._0_4_ * fVar204 + auVar129._0_4_ * fVar236;
            auVar93._12_4_ = auVar91._4_4_ * fVar206 + auVar129._4_4_ * fVar239;
            auVar148._16_16_ = auVar165;
            auVar148._0_16_ = auVar165;
            auVar182._16_16_ = auVar222;
            auVar182._0_16_ = auVar222;
            auVar233._16_16_ = auVar247;
            auVar233._0_16_ = auVar247;
            auVar108 = ZEXT2032(CONCAT416(fVar279,ZEXT416((uint)fVar281)));
            auVar108 = vshufps_avx(auVar108,auVar108,0);
            auVar20 = vsubps_avx(auVar182,auVar148);
            fVar185 = auVar108._0_4_;
            fVar202 = auVar108._4_4_;
            fVar204 = auVar108._8_4_;
            fVar206 = auVar108._12_4_;
            fVar209 = auVar108._16_4_;
            fVar234 = auVar108._20_4_;
            fVar236 = auVar108._24_4_;
            auVar149._0_4_ = auVar165._0_4_ + auVar20._0_4_ * fVar185;
            auVar149._4_4_ = auVar165._4_4_ + auVar20._4_4_ * fVar202;
            auVar149._8_4_ = auVar165._8_4_ + auVar20._8_4_ * fVar204;
            auVar149._12_4_ = auVar165._12_4_ + auVar20._12_4_ * fVar206;
            auVar149._16_4_ = auVar165._0_4_ + auVar20._16_4_ * fVar209;
            auVar149._20_4_ = auVar165._4_4_ + auVar20._20_4_ * fVar234;
            auVar149._24_4_ = auVar165._8_4_ + auVar20._24_4_ * fVar236;
            auVar149._28_4_ = auVar165._12_4_ + auVar20._28_4_;
            auVar108 = vsubps_avx(auVar233,auVar182);
            auVar183._0_4_ = auVar222._0_4_ + auVar108._0_4_ * fVar185;
            auVar183._4_4_ = auVar222._4_4_ + auVar108._4_4_ * fVar202;
            auVar183._8_4_ = auVar222._8_4_ + auVar108._8_4_ * fVar204;
            auVar183._12_4_ = auVar222._12_4_ + auVar108._12_4_ * fVar206;
            auVar183._16_4_ = auVar222._0_4_ + auVar108._16_4_ * fVar209;
            auVar183._20_4_ = auVar222._4_4_ + auVar108._20_4_ * fVar234;
            auVar183._24_4_ = auVar222._8_4_ + auVar108._24_4_ * fVar236;
            auVar183._28_4_ = auVar222._12_4_ + auVar108._28_4_;
            auVar96 = vsubps_avx(auVar93,auVar247);
            auVar112._0_4_ = auVar247._0_4_ + auVar96._0_4_ * fVar185;
            auVar112._4_4_ = auVar247._4_4_ + auVar96._4_4_ * fVar202;
            auVar112._8_4_ = auVar247._8_4_ + auVar96._8_4_ * fVar204;
            auVar112._12_4_ = auVar247._12_4_ + auVar96._12_4_ * fVar206;
            auVar112._16_4_ = auVar247._0_4_ + auVar96._0_4_ * fVar209;
            auVar112._20_4_ = auVar247._4_4_ + auVar96._4_4_ * fVar234;
            auVar112._24_4_ = auVar247._8_4_ + auVar96._8_4_ * fVar236;
            auVar112._28_4_ = auVar247._12_4_ + auVar96._12_4_;
            auVar108 = vsubps_avx(auVar183,auVar149);
            auVar150._0_4_ = auVar149._0_4_ + fVar185 * auVar108._0_4_;
            auVar150._4_4_ = auVar149._4_4_ + fVar202 * auVar108._4_4_;
            auVar150._8_4_ = auVar149._8_4_ + fVar204 * auVar108._8_4_;
            auVar150._12_4_ = auVar149._12_4_ + fVar206 * auVar108._12_4_;
            auVar150._16_4_ = auVar149._16_4_ + fVar209 * auVar108._16_4_;
            auVar150._20_4_ = auVar149._20_4_ + fVar234 * auVar108._20_4_;
            auVar150._24_4_ = auVar149._24_4_ + fVar236 * auVar108._24_4_;
            auVar150._28_4_ = auVar149._28_4_ + auVar108._28_4_;
            auVar108 = vsubps_avx(auVar112,auVar183);
            auVar113._0_4_ = auVar183._0_4_ + fVar185 * auVar108._0_4_;
            auVar113._4_4_ = auVar183._4_4_ + fVar202 * auVar108._4_4_;
            auVar113._8_4_ = auVar183._8_4_ + fVar204 * auVar108._8_4_;
            auVar113._12_4_ = auVar183._12_4_ + fVar206 * auVar108._12_4_;
            auVar113._16_4_ = auVar183._16_4_ + fVar209 * auVar108._16_4_;
            auVar113._20_4_ = auVar183._20_4_ + fVar234 * auVar108._20_4_;
            auVar113._24_4_ = auVar183._24_4_ + fVar236 * auVar108._24_4_;
            auVar113._28_4_ = auVar183._28_4_ + auVar108._28_4_;
            auVar108 = vsubps_avx(auVar113,auVar150);
            auVar261._0_4_ = auVar150._0_4_ + fVar185 * auVar108._0_4_;
            auVar261._4_4_ = auVar150._4_4_ + fVar202 * auVar108._4_4_;
            auVar261._8_4_ = auVar150._8_4_ + fVar204 * auVar108._8_4_;
            auVar261._12_4_ = auVar150._12_4_ + fVar206 * auVar108._12_4_;
            auVar266._16_4_ = auVar150._16_4_ + fVar209 * auVar108._16_4_;
            auVar266._0_16_ = auVar261;
            auVar266._20_4_ = auVar150._20_4_ + fVar234 * auVar108._20_4_;
            auVar266._24_4_ = auVar150._24_4_ + fVar236 * auVar108._24_4_;
            auVar266._28_4_ = auVar150._28_4_ + auVar183._28_4_;
            auVar267 = auVar266._16_16_;
            auVar132 = vshufps_avx(ZEXT416((uint)(fVar280 * 0.33333334)),
                                   ZEXT416((uint)(fVar280 * 0.33333334)),0);
            auVar223._0_4_ = auVar261._0_4_ + auVar132._0_4_ * auVar108._0_4_ * 3.0;
            auVar223._4_4_ = auVar261._4_4_ + auVar132._4_4_ * auVar108._4_4_ * 3.0;
            auVar223._8_4_ = auVar261._8_4_ + auVar132._8_4_ * auVar108._8_4_ * 3.0;
            auVar223._12_4_ = auVar261._12_4_ + auVar132._12_4_ * auVar108._12_4_ * 3.0;
            auVar181 = vshufpd_avx(auVar261,auVar261,3);
            auVar144 = vshufpd_avx(auVar267,auVar267,3);
            auVar96 = vsubps_avx(auVar181,auVar261);
            auVar216 = vsubps_avx(auVar144,auVar267);
            auVar94._0_4_ = auVar96._0_4_ + auVar216._0_4_;
            auVar94._4_4_ = auVar96._4_4_ + auVar216._4_4_;
            auVar94._8_4_ = auVar96._8_4_ + auVar216._8_4_;
            auVar94._12_4_ = auVar96._12_4_ + auVar216._12_4_;
            auVar96 = vmovshdup_avx(auVar261);
            auVar216 = vmovshdup_avx(auVar223);
            auVar167 = vshufps_avx(auVar94,auVar94,0);
            auVar133 = vshufps_avx(auVar94,auVar94,0x55);
            fVar185 = auVar133._0_4_;
            fVar202 = auVar133._4_4_;
            fVar204 = auVar133._8_4_;
            fVar206 = auVar133._12_4_;
            fVar209 = auVar167._0_4_;
            fVar234 = auVar167._4_4_;
            fVar236 = auVar167._8_4_;
            fVar239 = auVar167._12_4_;
            auVar95._0_4_ = fVar209 * auVar261._0_4_ + auVar96._0_4_ * fVar185;
            auVar95._4_4_ = fVar234 * auVar261._4_4_ + auVar96._4_4_ * fVar202;
            auVar95._8_4_ = fVar236 * auVar261._8_4_ + auVar96._8_4_ * fVar204;
            auVar95._12_4_ = fVar239 * auVar261._12_4_ + auVar96._12_4_ * fVar206;
            auVar332._0_4_ = fVar209 * auVar223._0_4_ + auVar216._0_4_ * fVar185;
            auVar332._4_4_ = fVar234 * auVar223._4_4_ + auVar216._4_4_ * fVar202;
            auVar332._8_4_ = fVar236 * auVar223._8_4_ + auVar216._8_4_ * fVar204;
            auVar332._12_4_ = fVar239 * auVar223._12_4_ + auVar216._12_4_ * fVar206;
            auVar216 = vshufps_avx(auVar95,auVar95,0xe8);
            auVar167 = vshufps_avx(auVar332,auVar332,0xe8);
            auVar96 = vcmpps_avx(auVar216,auVar167,1);
            uVar64 = vextractps_avx(auVar96,0);
            auVar133 = auVar332;
            if ((uVar64 & 1) == 0) {
              auVar133 = auVar95;
            }
            auVar131._0_4_ = auVar132._0_4_ * auVar108._16_4_ * 3.0;
            auVar131._4_4_ = auVar132._4_4_ * auVar108._20_4_ * 3.0;
            auVar131._8_4_ = auVar132._8_4_ * auVar108._24_4_ * 3.0;
            auVar131._12_4_ = auVar132._12_4_ * 0.0;
            auVar78 = vsubps_avx(auVar267,auVar131);
            auVar132 = vmovshdup_avx(auVar78);
            auVar267 = vmovshdup_avx(auVar267);
            fVar116 = auVar78._0_4_;
            fVar117 = auVar78._4_4_;
            auVar248._0_4_ = fVar116 * fVar209 + auVar132._0_4_ * fVar185;
            auVar248._4_4_ = fVar117 * fVar234 + auVar132._4_4_ * fVar202;
            auVar248._8_4_ = auVar78._8_4_ * fVar236 + auVar132._8_4_ * fVar204;
            auVar248._12_4_ = auVar78._12_4_ * fVar239 + auVar132._12_4_ * fVar206;
            auVar365._0_4_ = fVar209 * auVar266._16_4_ + auVar267._0_4_ * fVar185;
            auVar365._4_4_ = fVar234 * auVar266._20_4_ + auVar267._4_4_ * fVar202;
            auVar365._8_4_ = fVar236 * auVar266._24_4_ + auVar267._8_4_ * fVar204;
            auVar365._12_4_ = fVar239 * auVar266._28_4_ + auVar267._12_4_ * fVar206;
            auVar267 = vshufps_avx(auVar248,auVar248,0xe8);
            auVar17 = vshufps_avx(auVar365,auVar365,0xe8);
            auVar132 = vcmpps_avx(auVar267,auVar17,1);
            uVar64 = vextractps_avx(auVar132,0);
            auVar79 = auVar365;
            if ((uVar64 & 1) == 0) {
              auVar79 = auVar248;
            }
            auVar133 = vmaxss_avx(auVar79,auVar133);
            auVar216 = vminps_avx(auVar216,auVar167);
            auVar167 = vminps_avx(auVar267,auVar17);
            auVar167 = vminps_avx(auVar216,auVar167);
            auVar96 = vshufps_avx(auVar96,auVar96,0x55);
            auVar96 = vblendps_avx(auVar96,auVar132,2);
            auVar132 = vpslld_avx(auVar96,0x1f);
            auVar96 = vshufpd_avx(auVar332,auVar332,1);
            auVar96 = vinsertps_avx(auVar96,auVar365,0x9c);
            auVar216 = vshufpd_avx(auVar95,auVar95,1);
            auVar216 = vinsertps_avx(auVar216,auVar248,0x9c);
            auVar96 = vblendvps_avx(auVar216,auVar96,auVar132);
            auVar216 = vmovshdup_avx(auVar96);
            auVar96 = vmaxss_avx(auVar216,auVar96);
            fVar204 = auVar167._0_4_;
            auVar216 = vmovshdup_avx(auVar167);
            fVar202 = auVar96._0_4_;
            fVar206 = auVar216._0_4_;
            fVar185 = auVar133._0_4_;
            if ((fVar204 < 0.0001) && (-0.0001 < fVar202)) break;
            if ((fVar206 < 0.0001 && -0.0001 < fVar185) || (fVar204 < 0.0001 && -0.0001 < fVar185))
            break;
            auVar132 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar96,1);
            auVar216 = vcmpps_avx(auVar216,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar216 = vandps_avx(auVar216,auVar132);
          } while ((auVar216 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar132 = vcmpps_avx(auVar167,_DAT_01f45a50,1);
          auVar216 = vcmpss_avx(auVar133,ZEXT416(0) << 0x20,1);
          auVar166._8_4_ = 0x3f800000;
          auVar166._0_8_ = 0x3f8000003f800000;
          auVar166._12_4_ = 0x3f800000;
          auVar224._8_4_ = 0xbf800000;
          auVar224._0_8_ = 0xbf800000bf800000;
          auVar224._12_4_ = 0xbf800000;
          auVar216 = vblendvps_avx(auVar166,auVar224,auVar216);
          auVar132 = vblendvps_avx(auVar166,auVar224,auVar132);
          auVar167 = vcmpss_avx(auVar132,auVar216,4);
          auVar167 = vpshufd_avx(ZEXT416(auVar167._0_4_ & 1),0x50);
          auVar167 = vpslld_avx(auVar167,0x1f);
          auVar167 = vpsrad_avx(auVar167,0x1f);
          auVar167 = vpandn_avx(auVar167,_DAT_01f7afb0);
          auVar133 = vmovshdup_avx(auVar132);
          fVar209 = auVar133._0_4_;
          if ((auVar132._0_4_ != fVar209) || (NAN(auVar132._0_4_) || NAN(fVar209))) {
            if ((fVar206 != fVar204) || (NAN(fVar206) || NAN(fVar204))) {
              fVar204 = -fVar204 / (fVar206 - fVar204);
              auVar132 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar204) * 0.0 + fVar204)));
            }
            else {
              auVar132 = ZEXT816(0x3f80000000000000);
              if ((fVar204 != 0.0) || (NAN(fVar204))) {
                auVar132 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar267 = vcmpps_avx(auVar167,auVar132,1);
            auVar133 = vblendps_avx(auVar167,auVar132,2);
            auVar132 = vblendps_avx(auVar132,auVar167,2);
            auVar167 = vblendvps_avx(auVar132,auVar133,auVar267);
          }
          auVar96 = vcmpss_avx(auVar96,ZEXT416(0) << 0x20,1);
          auVar168._8_4_ = 0x3f800000;
          auVar168._0_8_ = 0x3f8000003f800000;
          auVar168._12_4_ = 0x3f800000;
          auVar225._8_4_ = 0xbf800000;
          auVar225._0_8_ = 0xbf800000bf800000;
          auVar225._12_4_ = 0xbf800000;
          auVar96 = vblendvps_avx(auVar168,auVar225,auVar96);
          fVar204 = auVar96._0_4_;
          if ((auVar216._0_4_ != fVar204) || (NAN(auVar216._0_4_) || NAN(fVar204))) {
            if ((fVar202 != fVar185) || (NAN(fVar202) || NAN(fVar185))) {
              fVar185 = -fVar185 / (fVar202 - fVar185);
              auVar96 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar185) * 0.0 + fVar185)));
            }
            else {
              auVar96 = ZEXT816(0x3f80000000000000);
              if ((fVar185 != 0.0) || (NAN(fVar185))) {
                auVar96 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar132 = vcmpps_avx(auVar167,auVar96,1);
            auVar216 = vblendps_avx(auVar167,auVar96,2);
            auVar96 = vblendps_avx(auVar96,auVar167,2);
            auVar167 = vblendvps_avx(auVar96,auVar216,auVar132);
          }
          if ((fVar209 != fVar204) || (NAN(fVar209) || NAN(fVar204))) {
            auVar97._8_4_ = 0x3f800000;
            auVar97._0_8_ = 0x3f8000003f800000;
            auVar97._12_4_ = 0x3f800000;
            auVar96 = vcmpps_avx(auVar167,auVar97,1);
            auVar216 = vinsertps_avx(auVar167,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar169._4_12_ = auVar167._4_12_;
            auVar169._0_4_ = 0x3f800000;
            auVar167 = vblendvps_avx(auVar169,auVar216,auVar96);
          }
          auVar96 = vcmpps_avx(auVar167,_DAT_01f46740,1);
          auVar56._12_4_ = 0;
          auVar56._0_12_ = auVar167._4_12_;
          auVar216 = vinsertps_avx(auVar167,ZEXT416(0x3f800000),0x10);
          auVar96 = vblendvps_avx(auVar216,auVar56 << 0x20,auVar96);
          auVar216 = vmovshdup_avx(auVar96);
        } while (auVar216._0_4_ < auVar96._0_4_);
        auVar98._0_4_ = auVar96._0_4_ + -0.1;
        auVar98._4_4_ = auVar96._4_4_ + 0.1;
        auVar98._8_4_ = auVar96._8_4_ + 0.0;
        auVar98._12_4_ = auVar96._12_4_ + 0.0;
        auVar132 = vshufpd_avx(auVar223,auVar223,3);
        auVar262._8_8_ = 0x3f80000000000000;
        auVar262._0_8_ = 0x3f80000000000000;
        auVar96 = vcmpps_avx(auVar98,auVar262,1);
        auVar54._12_4_ = 0;
        auVar54._0_12_ = auVar98._4_12_;
        auVar216 = vinsertps_avx(auVar98,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar96 = vblendvps_avx(auVar216,auVar54 << 0x20,auVar96);
        auVar216 = vshufpd_avx(auVar78,auVar78,3);
        auVar167 = vshufps_avx(auVar96,auVar96,0x50);
        auVar263._8_4_ = 0x3f800000;
        auVar263._0_8_ = 0x3f8000003f800000;
        auVar263._12_4_ = 0x3f800000;
        auVar133 = vsubps_avx(auVar263,auVar167);
        local_600 = auVar181._0_4_;
        fStack_5fc = auVar181._4_4_;
        fStack_5f8 = auVar181._8_4_;
        fStack_5f4 = auVar181._12_4_;
        fVar185 = auVar167._0_4_;
        fVar202 = auVar167._4_4_;
        fVar204 = auVar167._8_4_;
        fVar206 = auVar167._12_4_;
        local_660 = auVar144._0_4_;
        fStack_65c = auVar144._4_4_;
        fStack_658 = auVar144._8_4_;
        fStack_654 = auVar144._12_4_;
        fVar209 = auVar133._0_4_;
        fVar234 = auVar133._4_4_;
        fVar236 = auVar133._8_4_;
        fVar239 = auVar133._12_4_;
        auVar99._0_4_ = fVar185 * local_600 + fVar209 * auVar261._0_4_;
        auVar99._4_4_ = fVar202 * fStack_5fc + fVar234 * auVar261._4_4_;
        auVar99._8_4_ = fVar204 * fStack_5f8 + fVar236 * auVar261._0_4_;
        auVar99._12_4_ = fVar206 * fStack_5f4 + fVar239 * auVar261._4_4_;
        auVar249._0_4_ = auVar132._0_4_ * fVar185 + fVar209 * auVar223._0_4_;
        auVar249._4_4_ = auVar132._4_4_ * fVar202 + fVar234 * auVar223._4_4_;
        auVar249._8_4_ = auVar132._8_4_ * fVar204 + fVar236 * auVar223._0_4_;
        auVar249._12_4_ = auVar132._12_4_ * fVar206 + fVar239 * auVar223._4_4_;
        auVar276._0_4_ = auVar216._0_4_ * fVar185 + fVar209 * fVar116;
        auVar276._4_4_ = auVar216._4_4_ * fVar202 + fVar234 * fVar117;
        auVar276._8_4_ = auVar216._8_4_ * fVar204 + fVar236 * fVar116;
        auVar276._12_4_ = auVar216._12_4_ * fVar206 + fVar239 * fVar117;
        auVar323._0_4_ = fVar185 * local_660 + fVar209 * auVar266._16_4_;
        auVar323._4_4_ = fVar202 * fStack_65c + fVar234 * auVar266._20_4_;
        auVar323._8_4_ = fVar204 * fStack_658 + fVar236 * auVar266._16_4_;
        auVar323._12_4_ = fVar206 * fStack_654 + fVar239 * auVar266._20_4_;
        auVar144 = vsubps_avx(auVar263,auVar96);
        auVar216 = vmovshdup_avx(auVar331);
        auVar181 = vmovsldup_avx(auVar331);
        auVar264._0_4_ = auVar144._0_4_ * auVar181._0_4_ + auVar96._0_4_ * auVar216._0_4_;
        auVar264._4_4_ = auVar144._4_4_ * auVar181._4_4_ + auVar96._4_4_ * auVar216._4_4_;
        auVar264._8_4_ = auVar144._8_4_ * auVar181._8_4_ + auVar96._8_4_ * auVar216._8_4_;
        auVar264._12_4_ = auVar144._12_4_ * auVar181._12_4_ + auVar96._12_4_ * auVar216._12_4_;
        auVar78 = vmovshdup_avx(auVar264);
        auVar96 = vsubps_avx(auVar249,auVar99);
        auVar170._0_4_ = auVar96._0_4_ * 3.0;
        auVar170._4_4_ = auVar96._4_4_ * 3.0;
        auVar170._8_4_ = auVar96._8_4_ * 3.0;
        auVar170._12_4_ = auVar96._12_4_ * 3.0;
        auVar96 = vsubps_avx(auVar276,auVar249);
        auVar198._0_4_ = auVar96._0_4_ * 3.0;
        auVar198._4_4_ = auVar96._4_4_ * 3.0;
        auVar198._8_4_ = auVar96._8_4_ * 3.0;
        auVar198._12_4_ = auVar96._12_4_ * 3.0;
        auVar96 = vsubps_avx(auVar323,auVar276);
        auVar295._0_4_ = auVar96._0_4_ * 3.0;
        auVar295._4_4_ = auVar96._4_4_ * 3.0;
        auVar295._8_4_ = auVar96._8_4_ * 3.0;
        auVar295._12_4_ = auVar96._12_4_ * 3.0;
        auVar216 = vminps_avx(auVar198,auVar295);
        auVar96 = vmaxps_avx(auVar198,auVar295);
        auVar216 = vminps_avx(auVar170,auVar216);
        auVar96 = vmaxps_avx(auVar170,auVar96);
        auVar181 = vshufpd_avx(auVar216,auVar216,3);
        auVar144 = vshufpd_avx(auVar96,auVar96,3);
        auVar216 = vminps_avx(auVar216,auVar181);
        auVar96 = vmaxps_avx(auVar96,auVar144);
        auVar181 = vshufps_avx(ZEXT416((uint)(1.0 / fVar280)),ZEXT416((uint)(1.0 / fVar280)),0);
        auVar296._0_4_ = auVar181._0_4_ * auVar216._0_4_;
        auVar296._4_4_ = auVar181._4_4_ * auVar216._4_4_;
        auVar296._8_4_ = auVar181._8_4_ * auVar216._8_4_;
        auVar296._12_4_ = auVar181._12_4_ * auVar216._12_4_;
        auVar307._0_4_ = auVar181._0_4_ * auVar96._0_4_;
        auVar307._4_4_ = auVar181._4_4_ * auVar96._4_4_;
        auVar307._8_4_ = auVar181._8_4_ * auVar96._8_4_;
        auVar307._12_4_ = auVar181._12_4_ * auVar96._12_4_;
        auVar133 = ZEXT416((uint)(1.0 / (auVar78._0_4_ - auVar264._0_4_)));
        auVar96 = vshufpd_avx(auVar99,auVar99,3);
        auVar216 = vshufpd_avx(auVar249,auVar249,3);
        auVar181 = vshufpd_avx(auVar276,auVar276,3);
        auVar144 = vshufpd_avx(auVar323,auVar323,3);
        auVar96 = vsubps_avx(auVar96,auVar99);
        auVar132 = vsubps_avx(auVar216,auVar249);
        auVar167 = vsubps_avx(auVar181,auVar276);
        auVar144 = vsubps_avx(auVar144,auVar323);
        auVar216 = vminps_avx(auVar96,auVar132);
        auVar96 = vmaxps_avx(auVar96,auVar132);
        auVar181 = vminps_avx(auVar167,auVar144);
        auVar181 = vminps_avx(auVar216,auVar181);
        auVar216 = vmaxps_avx(auVar167,auVar144);
        auVar96 = vmaxps_avx(auVar96,auVar216);
        auVar216 = vshufps_avx(auVar133,auVar133,0);
        auVar355._0_4_ = auVar216._0_4_ * auVar181._0_4_;
        auVar355._4_4_ = auVar216._4_4_ * auVar181._4_4_;
        auVar355._8_4_ = auVar216._8_4_ * auVar181._8_4_;
        auVar355._12_4_ = auVar216._12_4_ * auVar181._12_4_;
        auVar361._0_4_ = auVar216._0_4_ * auVar96._0_4_;
        auVar361._4_4_ = auVar216._4_4_ * auVar96._4_4_;
        auVar361._8_4_ = auVar216._8_4_ * auVar96._8_4_;
        auVar361._12_4_ = auVar216._12_4_ * auVar96._12_4_;
        auVar96 = vmovsldup_avx(auVar264);
        auVar324._4_12_ = auVar96._4_12_;
        auVar324._0_4_ = fVar281;
        auVar333._4_12_ = auVar264._4_12_;
        auVar333._0_4_ = fVar279;
        auVar199._0_4_ = (fVar281 + fVar279) * 0.5;
        auVar199._4_4_ = (auVar96._4_4_ + auVar264._4_4_) * 0.5;
        auVar199._8_4_ = (auVar96._8_4_ + auVar264._8_4_) * 0.5;
        auVar199._12_4_ = (auVar96._12_4_ + auVar264._12_4_) * 0.5;
        auVar96 = vshufps_avx(auVar199,auVar199,0);
        fVar185 = auVar96._0_4_;
        fVar202 = auVar96._4_4_;
        fVar204 = auVar96._8_4_;
        fVar206 = auVar96._12_4_;
        local_6b0._0_4_ = auVar288._0_4_;
        local_6b0._4_4_ = auVar288._4_4_;
        fStack_6a8 = auVar288._8_4_;
        fStack_6a4 = auVar288._12_4_;
        auVar134._0_4_ = fVar185 * (float)local_350._0_4_ + (float)local_6b0._0_4_;
        auVar134._4_4_ = fVar202 * (float)local_350._4_4_ + (float)local_6b0._4_4_;
        auVar134._8_4_ = fVar204 * fStack_348 + fStack_6a8;
        auVar134._12_4_ = fVar206 * fStack_344 + fStack_6a4;
        local_630 = auVar16._0_4_;
        fStack_62c = auVar16._4_4_;
        fStack_628 = auVar16._8_4_;
        fStack_624 = auVar16._12_4_;
        auVar171._0_4_ = fVar185 * (float)local_360._0_4_ + local_630;
        auVar171._4_4_ = fVar202 * (float)local_360._4_4_ + fStack_62c;
        auVar171._8_4_ = fVar204 * fStack_358 + fStack_628;
        auVar171._12_4_ = fVar206 * fStack_354 + fStack_624;
        local_640 = auVar15._0_4_;
        fStack_63c = auVar15._4_4_;
        fStack_638 = auVar15._8_4_;
        fStack_634 = auVar15._12_4_;
        auVar250._0_4_ = fVar185 * (float)local_370._0_4_ + local_640;
        auVar250._4_4_ = fVar202 * (float)local_370._4_4_ + fStack_63c;
        auVar250._8_4_ = fVar204 * fStack_368 + fStack_638;
        auVar250._12_4_ = fVar206 * fStack_364 + fStack_634;
        auVar96 = vsubps_avx(auVar171,auVar134);
        auVar135._0_4_ = auVar134._0_4_ + fVar185 * auVar96._0_4_;
        auVar135._4_4_ = auVar134._4_4_ + fVar202 * auVar96._4_4_;
        auVar135._8_4_ = auVar134._8_4_ + fVar204 * auVar96._8_4_;
        auVar135._12_4_ = auVar134._12_4_ + fVar206 * auVar96._12_4_;
        auVar96 = vsubps_avx(auVar250,auVar171);
        auVar172._0_4_ = auVar171._0_4_ + fVar185 * auVar96._0_4_;
        auVar172._4_4_ = auVar171._4_4_ + fVar202 * auVar96._4_4_;
        auVar172._8_4_ = auVar171._8_4_ + fVar204 * auVar96._8_4_;
        auVar172._12_4_ = auVar171._12_4_ + fVar206 * auVar96._12_4_;
        auVar96 = vsubps_avx(auVar172,auVar135);
        fVar185 = auVar135._0_4_ + fVar185 * auVar96._0_4_;
        fVar202 = auVar135._4_4_ + fVar202 * auVar96._4_4_;
        auVar100._0_8_ = CONCAT44(fVar202,fVar185);
        auVar100._8_4_ = auVar135._8_4_ + fVar204 * auVar96._8_4_;
        auVar100._12_4_ = auVar135._12_4_ + fVar206 * auVar96._12_4_;
        fVar204 = auVar96._0_4_ * 3.0;
        fVar206 = auVar96._4_4_ * 3.0;
        auVar136._0_8_ = CONCAT44(fVar206,fVar204);
        auVar136._8_4_ = auVar96._8_4_ * 3.0;
        auVar136._12_4_ = auVar96._12_4_ * 3.0;
        auVar173._8_8_ = auVar100._0_8_;
        auVar173._0_8_ = auVar100._0_8_;
        auVar96 = vshufpd_avx(auVar100,auVar100,3);
        auVar216 = vshufps_avx(auVar199,auVar199,0x55);
        auVar167 = vsubps_avx(auVar96,auVar173);
        auVar343._0_4_ = auVar167._0_4_ * auVar216._0_4_ + fVar185;
        auVar343._4_4_ = auVar167._4_4_ * auVar216._4_4_ + fVar202;
        auVar343._8_4_ = auVar167._8_4_ * auVar216._8_4_ + fVar185;
        auVar343._12_4_ = auVar167._12_4_ * auVar216._12_4_ + fVar202;
        auVar174._8_8_ = auVar136._0_8_;
        auVar174._0_8_ = auVar136._0_8_;
        auVar96 = vshufpd_avx(auVar136,auVar136,1);
        auVar96 = vsubps_avx(auVar96,auVar174);
        auVar137._0_4_ = auVar96._0_4_ * auVar216._0_4_ + fVar204;
        auVar137._4_4_ = auVar96._4_4_ * auVar216._4_4_ + fVar206;
        auVar137._8_4_ = auVar96._8_4_ * auVar216._8_4_ + fVar204;
        auVar137._12_4_ = auVar96._12_4_ * auVar216._12_4_ + fVar206;
        auVar216 = vmovshdup_avx(auVar137);
        auVar251._0_8_ = auVar216._0_8_ ^ 0x8000000080000000;
        auVar251._8_4_ = auVar216._8_4_ ^ 0x80000000;
        auVar251._12_4_ = auVar216._12_4_ ^ 0x80000000;
        auVar181 = vmovshdup_avx(auVar167);
        auVar96 = vunpcklps_avx(auVar181,auVar251);
        auVar144 = vshufps_avx(auVar96,auVar251,4);
        auVar101._0_8_ = auVar167._0_8_ ^ 0x8000000080000000;
        auVar101._8_4_ = -auVar167._8_4_;
        auVar101._12_4_ = -auVar167._12_4_;
        auVar96 = vmovlhps_avx(auVar101,auVar137);
        auVar132 = vshufps_avx(auVar96,auVar137,8);
        auVar96 = ZEXT416((uint)(auVar137._0_4_ * auVar181._0_4_ - auVar167._0_4_ * auVar216._0_4_))
        ;
        auVar216 = vshufps_avx(auVar96,auVar96,0);
        auVar96 = vdivps_avx(auVar144,auVar216);
        auVar216 = vdivps_avx(auVar132,auVar216);
        auVar132 = vinsertps_avx(auVar296,auVar355,0x1c);
        auVar167 = vinsertps_avx(auVar307,auVar361,0x1c);
        auVar133 = vinsertps_avx(auVar355,auVar296,0x4c);
        auVar267 = vinsertps_avx(auVar361,auVar307,0x4c);
        auVar181 = vmovsldup_avx(auVar96);
        auVar175._0_4_ = auVar181._0_4_ * auVar132._0_4_;
        auVar175._4_4_ = auVar181._4_4_ * auVar132._4_4_;
        auVar175._8_4_ = auVar181._8_4_ * auVar132._8_4_;
        auVar175._12_4_ = auVar181._12_4_ * auVar132._12_4_;
        auVar138._0_4_ = auVar167._0_4_ * auVar181._0_4_;
        auVar138._4_4_ = auVar167._4_4_ * auVar181._4_4_;
        auVar138._8_4_ = auVar167._8_4_ * auVar181._8_4_;
        auVar138._12_4_ = auVar167._12_4_ * auVar181._12_4_;
        auVar144 = vminps_avx(auVar175,auVar138);
        auVar181 = vmaxps_avx(auVar138,auVar175);
        auVar17 = vmovsldup_avx(auVar216);
        auVar362._0_4_ = auVar133._0_4_ * auVar17._0_4_;
        auVar362._4_4_ = auVar133._4_4_ * auVar17._4_4_;
        auVar362._8_4_ = auVar133._8_4_ * auVar17._8_4_;
        auVar362._12_4_ = auVar133._12_4_ * auVar17._12_4_;
        auVar176._0_4_ = auVar267._0_4_ * auVar17._0_4_;
        auVar176._4_4_ = auVar267._4_4_ * auVar17._4_4_;
        auVar176._8_4_ = auVar267._8_4_ * auVar17._8_4_;
        auVar176._12_4_ = auVar267._12_4_ * auVar17._12_4_;
        auVar17 = vminps_avx(auVar362,auVar176);
        auVar226._0_4_ = auVar144._0_4_ + auVar17._0_4_;
        auVar226._4_4_ = auVar144._4_4_ + auVar17._4_4_;
        auVar226._8_4_ = auVar144._8_4_ + auVar17._8_4_;
        auVar226._12_4_ = auVar144._12_4_ + auVar17._12_4_;
        auVar144 = vmaxps_avx(auVar176,auVar362);
        auVar17 = vsubps_avx(auVar324,auVar199);
        auVar79 = vsubps_avx(auVar333,auVar199);
        auVar139._0_4_ = auVar181._0_4_ + auVar144._0_4_;
        auVar139._4_4_ = auVar181._4_4_ + auVar144._4_4_;
        auVar139._8_4_ = auVar181._8_4_ + auVar144._8_4_;
        auVar139._12_4_ = auVar181._12_4_ + auVar144._12_4_;
        auVar177._8_8_ = 0x3f800000;
        auVar177._0_8_ = 0x3f800000;
        auVar181 = vsubps_avx(auVar177,auVar139);
        auVar144 = vsubps_avx(auVar177,auVar226);
        fVar236 = auVar17._0_4_;
        auVar227._0_4_ = fVar236 * auVar181._0_4_;
        fVar239 = auVar17._4_4_;
        auVar227._4_4_ = fVar239 * auVar181._4_4_;
        fVar116 = auVar17._8_4_;
        auVar227._8_4_ = fVar116 * auVar181._8_4_;
        fVar117 = auVar17._12_4_;
        auVar227._12_4_ = fVar117 * auVar181._12_4_;
        fVar204 = auVar79._0_4_;
        auVar140._0_4_ = fVar204 * auVar181._0_4_;
        fVar206 = auVar79._4_4_;
        auVar140._4_4_ = fVar206 * auVar181._4_4_;
        fVar209 = auVar79._8_4_;
        auVar140._8_4_ = fVar209 * auVar181._8_4_;
        fVar234 = auVar79._12_4_;
        auVar140._12_4_ = fVar234 * auVar181._12_4_;
        auVar334._0_4_ = fVar236 * auVar144._0_4_;
        auVar334._4_4_ = fVar239 * auVar144._4_4_;
        auVar334._8_4_ = fVar116 * auVar144._8_4_;
        auVar334._12_4_ = fVar117 * auVar144._12_4_;
        auVar178._0_4_ = fVar204 * auVar144._0_4_;
        auVar178._4_4_ = fVar206 * auVar144._4_4_;
        auVar178._8_4_ = fVar209 * auVar144._8_4_;
        auVar178._12_4_ = fVar234 * auVar144._12_4_;
        auVar181 = vminps_avx(auVar227,auVar334);
        auVar144 = vminps_avx(auVar140,auVar178);
        auVar17 = vminps_avx(auVar181,auVar144);
        auVar181 = vmaxps_avx(auVar334,auVar227);
        auVar144 = vmaxps_avx(auVar178,auVar140);
        auVar79 = vshufps_avx(auVar199,auVar199,0x54);
        auVar144 = vmaxps_avx(auVar144,auVar181);
        auVar121 = vshufps_avx(auVar343,auVar343,0);
        auVar152 = vshufps_avx(auVar343,auVar343,0x55);
        auVar181 = vhaddps_avx(auVar17,auVar17);
        auVar144 = vhaddps_avx(auVar144,auVar144);
        auVar200._0_4_ = auVar121._0_4_ * auVar96._0_4_ + auVar152._0_4_ * auVar216._0_4_;
        auVar200._4_4_ = auVar121._4_4_ * auVar96._4_4_ + auVar152._4_4_ * auVar216._4_4_;
        auVar200._8_4_ = auVar121._8_4_ * auVar96._8_4_ + auVar152._8_4_ * auVar216._8_4_;
        auVar200._12_4_ = auVar121._12_4_ * auVar96._12_4_ + auVar152._12_4_ * auVar216._12_4_;
        auVar17 = vsubps_avx(auVar79,auVar200);
        fVar185 = auVar17._0_4_ + auVar181._0_4_;
        fVar202 = auVar17._0_4_ + auVar144._0_4_;
        auVar181 = vmaxss_avx(ZEXT416((uint)fVar281),ZEXT416((uint)fVar185));
        auVar144 = vminss_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar279));
      } while (auVar144._0_4_ < auVar181._0_4_);
      auVar181 = vmovshdup_avx(auVar96);
      auVar102._0_4_ = auVar181._0_4_ * auVar132._0_4_;
      auVar102._4_4_ = auVar181._4_4_ * auVar132._4_4_;
      auVar102._8_4_ = auVar181._8_4_ * auVar132._8_4_;
      auVar102._12_4_ = auVar181._12_4_ * auVar132._12_4_;
      auVar141._0_4_ = auVar167._0_4_ * auVar181._0_4_;
      auVar141._4_4_ = auVar167._4_4_ * auVar181._4_4_;
      auVar141._8_4_ = auVar167._8_4_ * auVar181._8_4_;
      auVar141._12_4_ = auVar167._12_4_ * auVar181._12_4_;
      auVar144 = vminps_avx(auVar102,auVar141);
      auVar181 = vmaxps_avx(auVar141,auVar102);
      auVar132 = vmovshdup_avx(auVar216);
      auVar228._0_4_ = auVar133._0_4_ * auVar132._0_4_;
      auVar228._4_4_ = auVar133._4_4_ * auVar132._4_4_;
      auVar228._8_4_ = auVar133._8_4_ * auVar132._8_4_;
      auVar228._12_4_ = auVar133._12_4_ * auVar132._12_4_;
      auVar142._0_4_ = auVar267._0_4_ * auVar132._0_4_;
      auVar142._4_4_ = auVar267._4_4_ * auVar132._4_4_;
      auVar142._8_4_ = auVar267._8_4_ * auVar132._8_4_;
      auVar142._12_4_ = auVar267._12_4_ * auVar132._12_4_;
      auVar132 = vminps_avx(auVar228,auVar142);
      auVar179._0_4_ = auVar144._0_4_ + auVar132._0_4_;
      auVar179._4_4_ = auVar144._4_4_ + auVar132._4_4_;
      auVar179._8_4_ = auVar144._8_4_ + auVar132._8_4_;
      auVar179._12_4_ = auVar144._12_4_ + auVar132._12_4_;
      auVar144 = vmaxps_avx(auVar142,auVar228);
      auVar103._0_4_ = auVar181._0_4_ + auVar144._0_4_;
      auVar103._4_4_ = auVar181._4_4_ + auVar144._4_4_;
      auVar103._8_4_ = auVar181._8_4_ + auVar144._8_4_;
      auVar103._12_4_ = auVar181._12_4_ + auVar144._12_4_;
      auVar181 = vsubps_avx(auVar262,auVar103);
      auVar144 = vsubps_avx(auVar262,auVar179);
      auVar180._0_4_ = fVar236 * auVar181._0_4_;
      auVar180._4_4_ = fVar239 * auVar181._4_4_;
      auVar180._8_4_ = fVar116 * auVar181._8_4_;
      auVar180._12_4_ = fVar117 * auVar181._12_4_;
      auVar229._0_4_ = fVar236 * auVar144._0_4_;
      auVar229._4_4_ = fVar239 * auVar144._4_4_;
      auVar229._8_4_ = fVar116 * auVar144._8_4_;
      auVar229._12_4_ = fVar117 * auVar144._12_4_;
      auVar104._0_4_ = fVar204 * auVar181._0_4_;
      auVar104._4_4_ = fVar206 * auVar181._4_4_;
      auVar104._8_4_ = fVar209 * auVar181._8_4_;
      auVar104._12_4_ = fVar234 * auVar181._12_4_;
      auVar143._0_4_ = fVar204 * auVar144._0_4_;
      auVar143._4_4_ = fVar206 * auVar144._4_4_;
      auVar143._8_4_ = fVar209 * auVar144._8_4_;
      auVar143._12_4_ = fVar234 * auVar144._12_4_;
      auVar181 = vminps_avx(auVar180,auVar229);
      auVar144 = vminps_avx(auVar104,auVar143);
      auVar181 = vminps_avx(auVar181,auVar144);
      auVar144 = vmaxps_avx(auVar229,auVar180);
      auVar132 = vmaxps_avx(auVar143,auVar104);
      auVar181 = vhaddps_avx(auVar181,auVar181);
      auVar144 = vmaxps_avx(auVar132,auVar144);
      auVar144 = vhaddps_avx(auVar144,auVar144);
      auVar132 = vmovshdup_avx(auVar17);
      auVar167 = ZEXT416((uint)(auVar132._0_4_ + auVar181._0_4_));
      auVar181 = vmaxss_avx(auVar264,auVar167);
      auVar132 = ZEXT416((uint)(auVar132._0_4_ + auVar144._0_4_));
      auVar144 = vminss_avx(auVar132,auVar78);
    } while (auVar144._0_4_ < auVar181._0_4_);
    bVar71 = 0;
    if ((fVar281 < fVar185) && (fVar202 < fVar279)) {
      auVar181 = vcmpps_avx(auVar132,auVar78,1);
      auVar144 = vcmpps_avx(auVar264,auVar167,1);
      auVar181 = vandps_avx(auVar144,auVar181);
      bVar71 = auVar181[0];
    }
    auVar297._8_4_ = 0x7fffffff;
    auVar297._0_8_ = 0x7fffffff7fffffff;
    auVar297._12_4_ = 0x7fffffff;
    if ((3 < (uint)uVar67 || fVar280 < 0.001) || (bVar71 & 1) != 0) {
      lVar69 = 0xc9;
      do {
        lVar69 = lVar69 + -1;
        if (lVar69 == 0) goto LAB_008edd63;
        fVar280 = auVar17._0_4_;
        fVar279 = 1.0 - fVar280;
        auVar181 = ZEXT416((uint)(fVar279 * fVar279 * fVar279));
        auVar181 = vshufps_avx(auVar181,auVar181,0);
        auVar144 = ZEXT416((uint)(fVar280 * 3.0 * fVar279 * fVar279));
        auVar144 = vshufps_avx(auVar144,auVar144,0);
        auVar132 = ZEXT416((uint)(fVar279 * fVar280 * fVar280 * 3.0));
        auVar132 = vshufps_avx(auVar132,auVar132,0);
        auVar167 = ZEXT416((uint)(fVar280 * fVar280 * fVar280));
        auVar167 = vshufps_avx(auVar167,auVar167,0);
        fVar279 = (float)local_6b0._0_4_ * auVar181._0_4_ +
                  local_630 * auVar144._0_4_ +
                  (float)local_380._0_4_ * auVar167._0_4_ + local_640 * auVar132._0_4_;
        fVar280 = (float)local_6b0._4_4_ * auVar181._4_4_ +
                  fStack_62c * auVar144._4_4_ +
                  (float)local_380._4_4_ * auVar167._4_4_ + fStack_63c * auVar132._4_4_;
        auVar105._0_8_ = CONCAT44(fVar280,fVar279);
        auVar105._8_4_ =
             fStack_6a8 * auVar181._8_4_ +
             fStack_628 * auVar144._8_4_ + fStack_378 * auVar167._8_4_ + fStack_638 * auVar132._8_4_
        ;
        auVar105._12_4_ =
             fStack_6a4 * auVar181._12_4_ +
             fStack_624 * auVar144._12_4_ +
             fStack_374 * auVar167._12_4_ + fStack_634 * auVar132._12_4_;
        auVar145._8_8_ = auVar105._0_8_;
        auVar145._0_8_ = auVar105._0_8_;
        auVar144 = vshufpd_avx(auVar105,auVar105,1);
        auVar181 = vmovshdup_avx(auVar17);
        auVar144 = vsubps_avx(auVar144,auVar145);
        auVar106._0_4_ = auVar181._0_4_ * auVar144._0_4_ + fVar279;
        auVar106._4_4_ = auVar181._4_4_ * auVar144._4_4_ + fVar280;
        auVar106._8_4_ = auVar181._8_4_ * auVar144._8_4_ + fVar279;
        auVar106._12_4_ = auVar181._12_4_ * auVar144._12_4_ + fVar280;
        auVar181 = vshufps_avx(auVar106,auVar106,0);
        auVar144 = vshufps_avx(auVar106,auVar106,0x55);
        auVar146._0_4_ = auVar96._0_4_ * auVar181._0_4_ + auVar216._0_4_ * auVar144._0_4_;
        auVar146._4_4_ = auVar96._4_4_ * auVar181._4_4_ + auVar216._4_4_ * auVar144._4_4_;
        auVar146._8_4_ = auVar96._8_4_ * auVar181._8_4_ + auVar216._8_4_ * auVar144._8_4_;
        auVar146._12_4_ = auVar96._12_4_ * auVar181._12_4_ + auVar216._12_4_ * auVar144._12_4_;
        auVar17 = vsubps_avx(auVar17,auVar146);
        auVar181 = vandps_avx(auVar297,auVar106);
        auVar144 = vshufps_avx(auVar181,auVar181,0xf5);
        auVar181 = vmaxss_avx(auVar144,auVar181);
      } while ((float)local_390._0_4_ <= auVar181._0_4_);
      fVar279 = auVar17._0_4_;
      if ((0.0 <= fVar279) && (fVar279 <= 1.0)) {
        auVar96 = vmovshdup_avx(auVar17);
        fVar280 = auVar96._0_4_;
        if ((0.0 <= fVar280) && (fVar280 <= 1.0)) {
          auVar96 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar267 = vinsertps_avx(auVar96,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28)
          ;
          auVar96 = vdpps_avx(auVar267,local_3a0,0x7f);
          auVar216 = vdpps_avx(auVar267,local_3b0,0x7f);
          auVar181 = vdpps_avx(auVar267,local_3c0,0x7f);
          auVar144 = vdpps_avx(auVar267,local_3d0,0x7f);
          auVar132 = vdpps_avx(auVar267,local_3e0,0x7f);
          auVar167 = vdpps_avx(auVar267,local_3f0,0x7f);
          auVar133 = vdpps_avx(auVar267,local_400,0x7f);
          auVar267 = vdpps_avx(auVar267,local_410,0x7f);
          fVar206 = 1.0 - fVar280;
          fVar209 = 1.0 - fVar279;
          fVar281 = auVar17._4_4_;
          fVar185 = auVar17._8_4_;
          fVar202 = auVar17._12_4_;
          fVar204 = fVar209 * fVar279 * fVar279 * 3.0;
          auVar277._0_4_ = fVar279 * fVar279 * fVar279;
          auVar277._4_4_ = fVar281 * fVar281 * fVar281;
          auVar277._8_4_ = fVar185 * fVar185 * fVar185;
          auVar277._12_4_ = fVar202 * fVar202 * fVar202;
          fVar185 = fVar209 * fVar209 * fVar279 * 3.0;
          fVar202 = fVar209 * fVar209 * fVar209;
          fVar281 = fVar202 * (fVar206 * auVar96._0_4_ + fVar280 * auVar132._0_4_) +
                    (fVar206 * auVar216._0_4_ + auVar167._0_4_ * fVar280) * fVar185 +
                    fVar204 * (auVar133._0_4_ * fVar280 + fVar206 * auVar181._0_4_) +
                    auVar277._0_4_ * (fVar206 * auVar144._0_4_ + fVar280 * auVar267._0_4_);
          if (((fVar268 <= fVar281) &&
              (fVar206 = *(float *)(ray + k * 4 + 0x100), fVar281 <= fVar206)) &&
             (pGVar9 = (context->scene->geometries).items[uVar65].ptr,
             (pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
            auStack_f0 = vshufps_avx(auVar17,auVar17,0x55);
            auVar308._8_4_ = 0x3f800000;
            auVar308._0_8_ = 0x3f8000003f800000;
            auVar308._12_4_ = 0x3f800000;
            auVar96 = vsubps_avx(auVar308,auStack_f0);
            fVar234 = auStack_f0._0_4_;
            fVar236 = auStack_f0._4_4_;
            fVar239 = auStack_f0._8_4_;
            fVar116 = auStack_f0._12_4_;
            fVar117 = auVar96._0_4_;
            fVar118 = auVar96._4_4_;
            fVar119 = auVar96._8_4_;
            fVar208 = auVar96._12_4_;
            auVar325._0_4_ = fVar234 * (float)local_4c0._0_4_ + fVar117 * (float)local_4a0._0_4_;
            auVar325._4_4_ = fVar236 * (float)local_4c0._4_4_ + fVar118 * (float)local_4a0._4_4_;
            auVar325._8_4_ = fVar239 * fStack_4b8 + fVar119 * fStack_498;
            auVar325._12_4_ = fVar116 * fStack_4b4 + fVar208 * fStack_494;
            auVar335._0_4_ = fVar234 * (float)local_4d0._0_4_ + fVar117 * fVar237;
            auVar335._4_4_ = fVar236 * (float)local_4d0._4_4_ + fVar118 * fVar240;
            auVar335._8_4_ = fVar239 * fStack_4c8 + fVar119 * fVar238;
            auVar335._12_4_ = fVar116 * fStack_4c4 + fVar208 * fVar241;
            auVar344._0_4_ = fVar234 * fVar76 + fVar117 * (float)local_4b0._0_4_;
            auVar344._4_4_ = fVar236 * fVar203 + fVar118 * (float)local_4b0._4_4_;
            auVar344._8_4_ = fVar239 * fVar207 + fVar119 * fStack_4a8;
            auVar344._12_4_ = fVar116 * fVar235 + fVar208 * fStack_4a4;
            auVar309._0_4_ = fVar234 * (float)local_430._0_4_ + fVar117 * fVar75;
            auVar309._4_4_ = fVar236 * (float)local_430._4_4_ + fVar118 * fVar186;
            auVar309._8_4_ = fVar239 * fStack_428 + fVar119 * fVar205;
            auVar309._12_4_ = fVar116 * fStack_424 + fVar208 * fVar210;
            auVar144 = vsubps_avx(auVar335,auVar325);
            auVar132 = vsubps_avx(auVar344,auVar335);
            auVar167 = vsubps_avx(auVar309,auVar344);
            auStack_110 = vshufps_avx(auVar17,auVar17,0);
            fVar116 = auStack_110._0_4_;
            fVar117 = auStack_110._4_4_;
            fVar118 = auStack_110._8_4_;
            fVar119 = auStack_110._12_4_;
            auVar96 = vshufps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),0);
            fVar209 = auVar96._0_4_;
            fVar234 = auVar96._4_4_;
            fVar236 = auVar96._8_4_;
            fVar239 = auVar96._12_4_;
            auVar96 = vshufps_avx(auVar277,auVar277,0);
            auVar216 = vshufps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar204),0);
            auVar181 = vshufps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),0);
            auVar265._0_4_ =
                 (fVar209 * (fVar209 * auVar144._0_4_ + fVar116 * auVar132._0_4_) +
                 fVar116 * (fVar209 * auVar132._0_4_ + fVar116 * auVar167._0_4_)) * 3.0;
            auVar265._4_4_ =
                 (fVar234 * (fVar234 * auVar144._4_4_ + fVar117 * auVar132._4_4_) +
                 fVar117 * (fVar234 * auVar132._4_4_ + fVar117 * auVar167._4_4_)) * 3.0;
            auVar265._8_4_ =
                 (fVar236 * (fVar236 * auVar144._8_4_ + fVar118 * auVar132._8_4_) +
                 fVar118 * (fVar236 * auVar132._8_4_ + fVar118 * auVar167._8_4_)) * 3.0;
            auVar265._12_4_ =
                 (fVar239 * (fVar239 * auVar144._12_4_ + fVar119 * auVar132._12_4_) +
                 fVar119 * (fVar239 * auVar132._12_4_ + fVar119 * auVar167._12_4_)) * 3.0;
            auVar144 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
            auVar230._0_4_ =
                 auVar144._0_4_ * (float)local_440._0_4_ +
                 auVar181._0_4_ * (float)local_450._0_4_ +
                 auVar96._0_4_ * (float)local_470._0_4_ + auVar216._0_4_ * (float)local_460._0_4_;
            auVar230._4_4_ =
                 auVar144._4_4_ * (float)local_440._4_4_ +
                 auVar181._4_4_ * (float)local_450._4_4_ +
                 auVar96._4_4_ * (float)local_470._4_4_ + auVar216._4_4_ * (float)local_460._4_4_;
            auVar230._8_4_ =
                 auVar144._8_4_ * fStack_438 +
                 auVar181._8_4_ * fStack_448 +
                 auVar96._8_4_ * fStack_468 + auVar216._8_4_ * fStack_458;
            auVar230._12_4_ =
                 auVar144._12_4_ * fStack_434 +
                 auVar181._12_4_ * fStack_444 +
                 auVar96._12_4_ * fStack_464 + auVar216._12_4_ * fStack_454;
            auVar96 = vshufps_avx(auVar265,auVar265,0xc9);
            auVar252._0_4_ = auVar230._0_4_ * auVar96._0_4_;
            auVar252._4_4_ = auVar230._4_4_ * auVar96._4_4_;
            auVar252._8_4_ = auVar230._8_4_ * auVar96._8_4_;
            auVar252._12_4_ = auVar230._12_4_ * auVar96._12_4_;
            auVar96 = vshufps_avx(auVar230,auVar230,0xc9);
            auVar231._0_4_ = auVar265._0_4_ * auVar96._0_4_;
            auVar231._4_4_ = auVar265._4_4_ * auVar96._4_4_;
            auVar231._8_4_ = auVar265._8_4_ * auVar96._8_4_;
            auVar231._12_4_ = auVar265._12_4_ * auVar96._12_4_;
            auVar96 = vsubps_avx(auVar231,auVar252);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              auStack_170 = vshufps_avx(auVar96,auVar96,0x55);
              auStack_150 = vshufps_avx(auVar96,auVar96,0xaa);
              auStack_130 = vshufps_avx(auVar96,auVar96,0);
              local_180[0] = (RTCHitN)auStack_170[0];
              local_180[1] = (RTCHitN)auStack_170[1];
              local_180[2] = (RTCHitN)auStack_170[2];
              local_180[3] = (RTCHitN)auStack_170[3];
              local_180[4] = (RTCHitN)auStack_170[4];
              local_180[5] = (RTCHitN)auStack_170[5];
              local_180[6] = (RTCHitN)auStack_170[6];
              local_180[7] = (RTCHitN)auStack_170[7];
              local_180[8] = (RTCHitN)auStack_170[8];
              local_180[9] = (RTCHitN)auStack_170[9];
              local_180[10] = (RTCHitN)auStack_170[10];
              local_180[0xb] = (RTCHitN)auStack_170[0xb];
              local_180[0xc] = (RTCHitN)auStack_170[0xc];
              local_180[0xd] = (RTCHitN)auStack_170[0xd];
              local_180[0xe] = (RTCHitN)auStack_170[0xe];
              local_180[0xf] = (RTCHitN)auStack_170[0xf];
              local_160 = auStack_150;
              local_140 = auStack_130;
              local_120 = auStack_110;
              local_100 = auStack_f0;
              local_e0 = local_320._0_8_;
              uStack_d8 = local_320._8_8_;
              uStack_d0 = local_320._16_8_;
              uStack_c8 = local_320._24_8_;
              local_c0 = local_300;
              vcmpps_avx(local_300,local_300,0xf);
              uStack_9c = context->user->instID[0];
              local_a0 = uStack_9c;
              uStack_98 = uStack_9c;
              uStack_94 = uStack_9c;
              uStack_90 = uStack_9c;
              uStack_8c = uStack_9c;
              uStack_88 = uStack_9c;
              uStack_84 = uStack_9c;
              uStack_7c = context->user->instPrimID[0];
              local_80 = uStack_7c;
              uStack_78 = uStack_7c;
              uStack_74 = uStack_7c;
              uStack_70 = uStack_7c;
              uStack_6c = uStack_7c;
              uStack_68 = uStack_7c;
              uStack_64 = uStack_7c;
              *(float *)(ray + k * 4 + 0x100) = fVar281;
              local_520 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar72 & 0xf) << 4));
              local_510 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar72 >> 4) * 0x10)
              ;
              local_500.valid = (int *)local_520;
              local_500.geometryUserPtr = pGVar9->userPtr;
              local_500.context = context->user;
              local_500.hit = local_180;
              local_500.N = 8;
              local_500.ray = (RTCRayN *)ray;
              if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar9->intersectionFilterN)(&local_500);
              }
              auVar96 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
              auVar216 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
              auVar184._16_16_ = auVar216;
              auVar184._0_16_ = auVar96;
              auVar108 = _DAT_01f7b020 & ~auVar184;
              if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar108 >> 0x7f,0) != '\0') ||
                    (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar108 >> 0xbf,0) != '\0') ||
                  (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar108[0x1f] < '\0') {
                p_Var14 = context->args->filter;
                if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var14)(&local_500);
                }
                auVar96 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
                auVar216 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
                auVar114._16_16_ = auVar216;
                auVar114._0_16_ = auVar96;
                auVar108 = _DAT_01f7b020 & ~auVar114;
                if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar108 >> 0x7f,0) != '\0') ||
                      (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar108 >> 0xbf,0) != '\0') ||
                    (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar108[0x1f] < '\0') {
                  auVar115._0_8_ = auVar96._0_8_ ^ 0xffffffffffffffff;
                  auVar115._8_4_ = auVar96._8_4_ ^ 0xffffffff;
                  auVar115._12_4_ = auVar96._12_4_ ^ 0xffffffff;
                  auVar115._16_4_ = auVar216._0_4_ ^ 0xffffffff;
                  auVar115._20_4_ = auVar216._4_4_ ^ 0xffffffff;
                  auVar115._24_4_ = auVar216._8_4_ ^ 0xffffffff;
                  auVar115._28_4_ = auVar216._12_4_ ^ 0xffffffff;
                  auVar108 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])local_500.hit);
                  *(undefined1 (*) [32])(local_500.ray + 0x180) = auVar108;
                  auVar108 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])(local_500.hit + 0x20));
                  *(undefined1 (*) [32])(local_500.ray + 0x1a0) = auVar108;
                  auVar108 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])(local_500.hit + 0x40));
                  *(undefined1 (*) [32])(local_500.ray + 0x1c0) = auVar108;
                  auVar108 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])(local_500.hit + 0x60));
                  *(undefined1 (*) [32])(local_500.ray + 0x1e0) = auVar108;
                  auVar108 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])(local_500.hit + 0x80));
                  *(undefined1 (*) [32])(local_500.ray + 0x200) = auVar108;
                  auVar108 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])(local_500.hit + 0xa0));
                  *(undefined1 (*) [32])(local_500.ray + 0x220) = auVar108;
                  auVar108 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])(local_500.hit + 0xc0));
                  *(undefined1 (*) [32])(local_500.ray + 0x240) = auVar108;
                  auVar108 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])(local_500.hit + 0xe0));
                  *(undefined1 (*) [32])(local_500.ray + 0x260) = auVar108;
                  auVar108 = vmaskmovps_avx(auVar115,*(undefined1 (*) [32])(local_500.hit + 0x100));
                  *(undefined1 (*) [32])(local_500.ray + 0x280) = auVar108;
                  goto LAB_008edd63;
                }
              }
              *(float *)(ray + k * 4 + 0x100) = fVar206;
              goto LAB_008edd63;
            }
            *(float *)(ray + k * 4 + 0x100) = fVar281;
            uVar74 = vextractps_avx(auVar96,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar74;
            uVar74 = vextractps_avx(auVar96,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar74;
            *(int *)(ray + k * 4 + 0x1c0) = auVar96._0_4_;
            *(float *)(ray + k * 4 + 0x1e0) = fVar279;
            *(float *)(ray + k * 4 + 0x200) = fVar280;
            *(uint *)(ray + k * 4 + 0x220) = uVar8;
            *(uint *)(ray + k * 4 + 0x240) = uVar65;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
          }
        }
      }
      goto LAB_008edd63;
    }
    auVar96 = vinsertps_avx(ZEXT416((uint)fVar281),ZEXT416((uint)fVar279),0x10);
    auVar366 = ZEXT1664(auVar96);
    auVar337 = ZEXT1664(auVar264);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }